

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::sse2::CurveNiMBIntersectorK<4,4>::
     occluded_t<embree::sse2::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,4>,embree::sse2::Occluded1KEpilogMU<4,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  RTCRayQueryFlags *pRVar7;
  Primitive *pPVar8;
  undefined1 (*pauVar9) [12];
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  Primitive PVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  Geometry *pGVar26;
  __int_type_conflict _Var27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [16];
  undefined6 uVar62;
  undefined1 auVar63 [12];
  unkbyte9 Var64;
  undefined1 auVar65 [13];
  undefined1 auVar66 [12];
  undefined1 auVar67 [13];
  undefined1 auVar68 [12];
  undefined1 auVar69 [13];
  undefined1 auVar70 [12];
  undefined1 auVar71 [12];
  undefined1 auVar72 [12];
  undefined1 auVar73 [12];
  undefined1 auVar74 [12];
  undefined1 auVar75 [13];
  undefined1 auVar76 [12];
  undefined1 auVar77 [12];
  undefined1 auVar78 [12];
  undefined1 auVar79 [12];
  undefined1 auVar80 [12];
  undefined1 auVar81 [12];
  undefined1 auVar82 [12];
  undefined1 auVar83 [12];
  undefined1 auVar84 [12];
  undefined1 auVar85 [12];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  bool bVar90;
  undefined1 auVar91 [15];
  undefined1 auVar92 [15];
  undefined1 auVar93 [15];
  undefined1 auVar94 [15];
  bool bVar95;
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  bool bVar100;
  bool bVar101;
  undefined1 auVar102 [15];
  undefined1 auVar103 [15];
  undefined1 auVar104 [15];
  undefined1 auVar105 [15];
  undefined1 auVar106 [15];
  undefined1 auVar107 [15];
  undefined1 auVar108 [15];
  undefined1 auVar109 [15];
  undefined1 auVar110 [15];
  undefined1 auVar111 [15];
  undefined1 auVar112 [15];
  undefined1 auVar113 [15];
  undefined1 auVar114 [15];
  undefined1 auVar115 [15];
  undefined1 auVar116 [15];
  undefined1 auVar117 [15];
  undefined1 auVar118 [13];
  undefined1 auVar119 [13];
  undefined1 auVar120 [13];
  undefined1 auVar121 [13];
  undefined1 auVar122 [15];
  undefined1 auVar123 [15];
  undefined1 auVar124 [15];
  undefined1 auVar125 [15];
  ulong uVar126;
  RTCFilterFunctionN p_Var127;
  RTCRayN *pRVar128;
  long lVar129;
  RTCIntersectArguments *pRVar130;
  ulong uVar131;
  long lVar132;
  undefined4 uVar133;
  undefined8 unaff_RBP;
  ulong uVar135;
  byte bVar136;
  long lVar137;
  uint uVar138;
  uint uVar139;
  uint uVar140;
  uint uVar141;
  uint uVar142;
  short sVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  undefined1 auVar149 [12];
  float fVar206;
  undefined1 auVar154 [16];
  char cVar214;
  undefined1 auVar157 [16];
  undefined1 auVar150 [12];
  undefined1 auVar161 [16];
  undefined1 auVar151 [12];
  undefined1 auVar165 [16];
  undefined1 auVar152 [12];
  undefined1 auVar169 [16];
  float fVar211;
  float fVar215;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar153 [12];
  undefined1 auVar179 [16];
  undefined1 auVar183 [16];
  undefined1 auVar186 [16];
  undefined1 auVar189 [16];
  undefined1 auVar192 [16];
  undefined1 auVar195 [16];
  float fVar212;
  float fVar213;
  float fVar216;
  float fVar217;
  undefined8 uVar218;
  float fVar219;
  float fVar220;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar203;
  undefined1 auVar204 [16];
  float fVar221;
  float fVar222;
  float fVar253;
  float fVar255;
  vfloat4 v;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar228 [16];
  undefined1 auVar231 [16];
  undefined1 auVar234 [16];
  undefined1 auVar237 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  float fVar254;
  float fVar256;
  float fVar257;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar246;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  int iVar258;
  int iVar259;
  int iVar260;
  char cVar284;
  undefined1 uVar285;
  int iVar286;
  undefined1 auVar264 [16];
  char cVar287;
  undefined1 auVar268 [16];
  undefined1 auVar272 [16];
  undefined1 auVar276 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  float fVar288;
  float fVar289;
  float fVar290;
  float fVar296;
  float fVar300;
  undefined1 auVar291 [16];
  float fVar297;
  float fVar298;
  float fVar299;
  float fVar301;
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  float fVar306;
  float fVar318;
  float fVar319;
  float fVar320;
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  float fVar321;
  float fVar322;
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  char cVar331;
  float fVar323;
  float fVar324;
  float fVar332;
  float fVar334;
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  float fVar333;
  float fVar335;
  float fVar336;
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  float fVar337;
  float fVar338;
  float fVar341;
  float fVar342;
  float fVar344;
  float fVar346;
  undefined1 auVar339 [16];
  float fVar343;
  float fVar345;
  float fVar347;
  undefined1 auVar340 [16];
  float fVar348;
  float fVar349;
  float fVar351;
  float fVar352;
  float fVar353;
  float fVar354;
  float fVar355;
  float fVar356;
  undefined1 auVar350 [16];
  float fVar357;
  float fVar358;
  float fVar362;
  float fVar363;
  float fVar364;
  float fVar365;
  float fVar366;
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  float fVar367;
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  float fVar370;
  float fVar373;
  float fVar374;
  float fVar375;
  float fVar376;
  float fVar377;
  float fVar378;
  float fVar379;
  undefined1 auVar371 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar372;
  float fVar380;
  float fVar386;
  float fVar388;
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar383;
  float fVar387;
  float fVar389;
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  float fVar390;
  float fVar400;
  float fVar401;
  float fVar402;
  undefined1 auVar391 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar392;
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar398;
  undefined1 auVar399 [16];
  float fVar403;
  float fVar404;
  float fVar410;
  float fVar411;
  float fVar412;
  float fVar413;
  float fVar414;
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  float fVar415;
  float fVar416;
  float fVar420;
  float fVar421;
  float fVar422;
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  float fVar423;
  float fVar424;
  float fVar425;
  float fVar426;
  float fVar427;
  float fVar428;
  float fVar429;
  float fVar430;
  float fVar431;
  float fVar432;
  float fVar433;
  float fVar434;
  float fVar435;
  float fVar436;
  float fVar437;
  undefined4 local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  char local_4d8;
  char cStack_4d7;
  undefined1 uStack_4d6;
  undefined1 uStack_4d5;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  undefined2 local_448;
  undefined2 uStack_446;
  undefined2 uStack_444;
  undefined2 uStack_442;
  undefined4 local_428;
  undefined2 uStack_424;
  undefined2 uStack_422;
  undefined4 uStack_3fc;
  undefined8 local_3f8;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined1 local_3c8 [16];
  Precalculations *local_3b0;
  ulong local_3a8;
  RayQueryContext *local_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined1 (*local_340) [16];
  RTCFilterFunctionNArguments args;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_4> bhit;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  uint local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  uint local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  ulong uVar134;
  undefined1 auVar148 [12];
  undefined1 auVar176 [16];
  undefined1 auVar180 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar158 [16];
  undefined1 auVar162 [16];
  undefined1 auVar166 [16];
  undefined1 auVar170 [16];
  undefined1 auVar177 [16];
  undefined1 auVar181 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar171 [16];
  undefined1 auVar178 [16];
  undefined1 auVar182 [16];
  undefined2 uVar205;
  int iVar207;
  int iVar208;
  int iVar209;
  int iVar210;
  undefined1 auVar225 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar261 [12];
  undefined1 auVar262 [12];
  undefined1 auVar263 [12];
  undefined1 auVar269 [16];
  undefined1 auVar273 [16];
  undefined1 auVar277 [16];
  undefined1 auVar267 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar278 [16];
  
  PVar20 = prim[1];
  uVar126 = (ulong)(byte)PVar20;
  lVar129 = uVar126 * 0x25;
  uVar133 = *(undefined4 *)(prim + uVar126 * 4 + 6);
  uVar21 = *(undefined4 *)(prim + uVar126 * 5 + 6);
  uVar22 = *(undefined4 *)(prim + uVar126 * 6 + 6);
  uVar10 = *(undefined4 *)(prim + uVar126 * 0xf + 6);
  uVar23 = *(undefined4 *)(prim + (ulong)(byte)PVar20 * 0x10 + 6);
  uVar24 = *(undefined4 *)(prim + uVar126 * 0x11 + 6);
  uVar11 = *(undefined4 *)(prim + uVar126 * 0x1a + 6);
  uVar12 = *(undefined4 *)(prim + uVar126 * 0x1b + 6);
  uVar25 = *(undefined4 *)(prim + uVar126 * 0x1c + 6);
  pPVar8 = prim + lVar129 + 6;
  fVar412 = *(float *)(pPVar8 + 0xc);
  fVar221 = (*(float *)(ray + k * 4) - *(float *)pPVar8) * fVar412;
  fVar253 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar8 + 4)) * fVar412;
  fVar255 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar8 + 8)) * fVar412;
  fVar403 = *(float *)(ray + k * 4 + 0x40) * fVar412;
  fVar410 = *(float *)(ray + k * 4 + 0x50) * fVar412;
  fVar412 = *(float *)(ray + k * 4 + 0x60) * fVar412;
  uVar285 = (undefined1)((uint)uVar21 >> 0x18);
  uVar205 = CONCAT11(uVar285,uVar285);
  uVar285 = (undefined1)((uint)uVar21 >> 0x10);
  uVar218 = CONCAT35(CONCAT21(uVar205,uVar285),CONCAT14(uVar285,uVar21));
  cVar284 = (char)((uint)uVar21 >> 8);
  uVar62 = CONCAT51(CONCAT41((int)((ulong)uVar218 >> 0x20),cVar284),cVar284);
  cVar214 = (char)uVar21;
  uVar134 = CONCAT62(uVar62,CONCAT11(cVar214,cVar214));
  auVar266._8_4_ = 0;
  auVar266._0_8_ = uVar134;
  auVar266._12_2_ = uVar205;
  auVar266._14_2_ = uVar205;
  uVar205 = (undefined2)((ulong)uVar218 >> 0x20);
  auVar265._12_4_ = auVar266._12_4_;
  auVar265._8_2_ = 0;
  auVar265._0_8_ = uVar134;
  auVar265._10_2_ = uVar205;
  auVar264._10_6_ = auVar265._10_6_;
  auVar264._8_2_ = uVar205;
  auVar264._0_8_ = uVar134;
  uVar205 = (undefined2)uVar62;
  auVar63._4_8_ = auVar264._8_8_;
  auVar63._2_2_ = uVar205;
  auVar63._0_2_ = uVar205;
  iVar258 = (int)CONCAT11(cVar214,cVar214) >> 8;
  iVar286 = auVar63._0_4_ >> 0x18;
  auVar261._0_8_ = CONCAT44(iVar286,iVar258);
  auVar261._8_4_ = auVar264._8_4_ >> 0x18;
  auVar267._12_4_ = auVar265._12_4_ >> 0x18;
  auVar267._0_12_ = auVar261;
  fVar386 = (float)iVar286;
  cVar287 = cVar284 >> 7;
  auVar29[0xd] = 0;
  auVar29._0_13_ = auVar267._0_13_;
  auVar29[0xe] = cVar287;
  auVar33[0xc] = cVar287;
  auVar33._0_12_ = auVar261;
  auVar33._13_2_ = auVar29._13_2_;
  auVar37[0xb] = 0;
  auVar37._0_11_ = auVar261._0_11_;
  auVar37._12_3_ = auVar33._12_3_;
  auVar41[10] = cVar287;
  auVar41._0_10_ = auVar261._0_10_;
  auVar41._11_4_ = auVar37._11_4_;
  auVar45[9] = 0;
  auVar45._0_9_ = auVar261._0_9_;
  auVar45._10_5_ = auVar41._10_5_;
  auVar49[8] = cVar284;
  auVar49._0_8_ = auVar261._0_8_;
  auVar49._9_6_ = auVar45._9_6_;
  Var64 = CONCAT81(CONCAT71(auVar49._8_7_,(char)((uint)uVar22 >> 0x18)),(short)cVar214 >> 7);
  auVar53._6_9_ = Var64;
  auVar53[5] = (char)((uint)uVar22 >> 0x10);
  auVar53[4] = (undefined1)((short)cVar214 >> 7);
  auVar53._0_4_ = iVar258;
  cVar287 = (char)((uint)uVar22 >> 8);
  auVar65._2_11_ = auVar53._4_11_;
  auVar65[1] = cVar287;
  auVar65[0] = (undefined1)((short)cVar214 >> 7);
  cVar284 = (char)uVar22;
  auVar57._2_13_ = auVar65;
  auVar57._0_2_ = CONCAT11(cVar284,cVar214);
  uVar205 = (undefined2)Var64;
  auVar270._0_12_ = auVar57._0_12_;
  auVar270._12_2_ = uVar205;
  auVar270._14_2_ = uVar205;
  auVar269._12_4_ = auVar270._12_4_;
  auVar269._0_10_ = auVar57._0_10_;
  auVar269._10_2_ = auVar53._4_2_;
  auVar268._10_6_ = auVar269._10_6_;
  auVar268._0_8_ = auVar57._0_8_;
  auVar268._8_2_ = auVar53._4_2_;
  auVar66._4_8_ = auVar268._8_8_;
  auVar66._2_2_ = auVar65._0_2_;
  auVar66._0_2_ = auVar65._0_2_;
  iVar259 = (int)CONCAT11(cVar284,cVar214) >> 8;
  iVar286 = auVar66._0_4_ >> 0x18;
  auVar262._0_8_ = CONCAT44(iVar286,iVar259);
  auVar262._8_4_ = auVar268._8_4_ >> 0x18;
  auVar271._12_4_ = auVar269._12_4_ >> 0x18;
  auVar271._0_12_ = auVar262;
  fVar426 = (float)iVar286;
  cVar214 = cVar287 >> 7;
  auVar30[0xd] = 0;
  auVar30._0_13_ = auVar271._0_13_;
  auVar30[0xe] = cVar214;
  auVar34[0xc] = cVar214;
  auVar34._0_12_ = auVar262;
  auVar34._13_2_ = auVar30._13_2_;
  auVar38[0xb] = 0;
  auVar38._0_11_ = auVar262._0_11_;
  auVar38._12_3_ = auVar34._12_3_;
  auVar42[10] = cVar214;
  auVar42._0_10_ = auVar262._0_10_;
  auVar42._11_4_ = auVar38._11_4_;
  auVar46[9] = 0;
  auVar46._0_9_ = auVar262._0_9_;
  auVar46._10_5_ = auVar42._10_5_;
  auVar50[8] = cVar287;
  auVar50._0_8_ = auVar262._0_8_;
  auVar50._9_6_ = auVar46._9_6_;
  Var64 = CONCAT81(CONCAT71(auVar50._8_7_,(char)((uint)uVar23 >> 0x18)),(short)cVar284 >> 7);
  auVar54._6_9_ = Var64;
  auVar54[5] = (char)((uint)uVar23 >> 0x10);
  auVar54[4] = (undefined1)((short)cVar284 >> 7);
  auVar54._0_4_ = iVar259;
  cVar331 = (char)((uint)uVar23 >> 8);
  auVar67._2_11_ = auVar54._4_11_;
  auVar67[1] = cVar331;
  auVar67[0] = (undefined1)((short)cVar284 >> 7);
  cVar287 = (char)uVar23;
  auVar58._2_13_ = auVar67;
  auVar58._0_2_ = CONCAT11(cVar287,cVar284);
  uVar205 = (undefined2)Var64;
  auVar274._0_12_ = auVar58._0_12_;
  auVar274._12_2_ = uVar205;
  auVar274._14_2_ = uVar205;
  auVar273._12_4_ = auVar274._12_4_;
  auVar273._0_10_ = auVar58._0_10_;
  auVar273._10_2_ = auVar54._4_2_;
  auVar272._10_6_ = auVar273._10_6_;
  auVar272._0_8_ = auVar58._0_8_;
  auVar272._8_2_ = auVar54._4_2_;
  auVar68._4_8_ = auVar272._8_8_;
  auVar68._2_2_ = auVar67._0_2_;
  auVar68._0_2_ = auVar67._0_2_;
  iVar260 = (int)CONCAT11(cVar287,cVar284) >> 8;
  iVar286 = auVar68._0_4_ >> 0x18;
  auVar263._0_8_ = CONCAT44(iVar286,iVar260);
  auVar263._8_4_ = auVar272._8_4_ >> 0x18;
  auVar275._12_4_ = auVar273._12_4_ >> 0x18;
  auVar275._0_12_ = auVar263;
  fVar373 = (float)iVar286;
  cVar214 = cVar331 >> 7;
  auVar31[0xd] = 0;
  auVar31._0_13_ = auVar275._0_13_;
  auVar31[0xe] = cVar214;
  auVar35[0xc] = cVar214;
  auVar35._0_12_ = auVar263;
  auVar35._13_2_ = auVar31._13_2_;
  auVar39[0xb] = 0;
  auVar39._0_11_ = auVar263._0_11_;
  auVar39._12_3_ = auVar35._12_3_;
  auVar43[10] = cVar214;
  auVar43._0_10_ = auVar263._0_10_;
  auVar43._11_4_ = auVar39._11_4_;
  auVar47[9] = 0;
  auVar47._0_9_ = auVar263._0_9_;
  auVar47._10_5_ = auVar43._10_5_;
  auVar51[8] = cVar331;
  auVar51._0_8_ = auVar263._0_8_;
  auVar51._9_6_ = auVar47._9_6_;
  Var64 = CONCAT81(CONCAT71(auVar51._8_7_,(char)((uint)uVar24 >> 0x18)),(short)cVar287 >> 7);
  auVar55._6_9_ = Var64;
  auVar55[5] = (char)((uint)uVar24 >> 0x10);
  auVar55[4] = (undefined1)((short)cVar287 >> 7);
  auVar55._0_4_ = iVar260;
  auVar69._2_11_ = auVar55._4_11_;
  auVar69[1] = (char)((uint)uVar24 >> 8);
  auVar69[0] = (undefined1)((short)cVar287 >> 7);
  sVar143 = CONCAT11((char)uVar24,cVar287);
  auVar59._2_13_ = auVar69;
  auVar59._0_2_ = sVar143;
  uVar205 = (undefined2)Var64;
  auVar278._0_12_ = auVar59._0_12_;
  auVar278._12_2_ = uVar205;
  auVar278._14_2_ = uVar205;
  auVar277._12_4_ = auVar278._12_4_;
  auVar277._0_10_ = auVar59._0_10_;
  auVar277._10_2_ = auVar55._4_2_;
  auVar276._10_6_ = auVar277._10_6_;
  auVar276._0_8_ = auVar59._0_8_;
  auVar276._8_2_ = auVar55._4_2_;
  auVar70._4_8_ = auVar276._8_8_;
  auVar70._2_2_ = auVar69._0_2_;
  auVar70._0_2_ = auVar69._0_2_;
  fVar306 = (float)((int)sVar143 >> 8);
  fVar318 = (float)(auVar70._0_4_ >> 0x18);
  fVar320 = (float)(auVar276._8_4_ >> 0x18);
  fVar144 = fVar412 * fVar306;
  fVar206 = fVar412 * fVar318;
  auVar148._0_8_ = CONCAT44(fVar206,fVar144);
  auVar148._8_4_ = fVar412 * fVar320;
  auVar174._12_4_ = fVar412 * (float)(auVar277._12_4_ >> 0x18);
  auVar174._0_12_ = auVar148;
  fVar415 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar129 + 0x16)) *
            *(float *)(prim + lVar129 + 0x1a);
  local_4d8 = (char)uVar133;
  cStack_4d7 = (char)((uint)uVar133 >> 8);
  uStack_4d6 = (undefined1)((uint)uVar133 >> 0x10);
  uStack_4d5 = (undefined1)((uint)uVar133 >> 0x18);
  auVar86[0xd] = 0;
  auVar86._0_13_ = auVar174._0_13_;
  auVar86[0xe] = (char)((uint)fVar206 >> 0x18);
  auVar91[0xc] = (char)((uint)fVar206 >> 0x10);
  auVar91._0_12_ = auVar148;
  auVar91._13_2_ = auVar86._13_2_;
  auVar96[0xb] = 0;
  auVar96._0_11_ = auVar148._0_11_;
  auVar96._12_3_ = auVar91._12_3_;
  auVar102[10] = (char)((uint)fVar206 >> 8);
  auVar102._0_10_ = auVar148._0_10_;
  auVar102._11_4_ = auVar96._11_4_;
  auVar106[9] = 0;
  auVar106._0_9_ = auVar148._0_9_;
  auVar106._10_5_ = auVar102._10_5_;
  auVar110[8] = SUB41(fVar206,0);
  auVar110._0_8_ = auVar148._0_8_;
  auVar110._9_6_ = auVar106._9_6_;
  Var64 = CONCAT81(CONCAT71(auVar110._8_7_,uStack_4d5),(char)((uint)fVar144 >> 0x18));
  auVar114._6_9_ = Var64;
  auVar114[5] = uStack_4d6;
  auVar114[4] = (char)((uint)fVar144 >> 0x10);
  auVar114._0_4_ = fVar144;
  auVar118._2_11_ = auVar114._4_11_;
  auVar118[1] = cStack_4d7;
  auVar118[0] = (char)((uint)fVar144 >> 8);
  sVar143 = CONCAT11(local_4d8,SUB41(fVar144,0));
  auVar122._2_13_ = auVar118;
  auVar122._0_2_ = sVar143;
  uVar205 = (undefined2)Var64;
  auVar155._0_12_ = auVar122._0_12_;
  auVar155._12_2_ = uVar205;
  auVar155._14_2_ = uVar205;
  auVar154._12_4_ = auVar155._12_4_;
  auVar154._0_10_ = auVar122._0_10_;
  auVar154._10_2_ = auVar114._4_2_;
  auVar223._10_6_ = auVar154._10_6_;
  auVar223._0_8_ = auVar122._0_8_;
  auVar223._8_2_ = auVar114._4_2_;
  auVar71._4_8_ = auVar223._8_8_;
  auVar71._2_2_ = auVar118._0_2_;
  auVar71._0_2_ = auVar118._0_2_;
  iVar286 = (int)sVar143 >> 8;
  iVar207 = auVar71._0_4_ >> 0x18;
  auVar149._0_8_ = CONCAT44(iVar207,iVar286);
  auVar149._8_4_ = auVar223._8_4_ >> 0x18;
  auVar156._12_4_ = auVar154._12_4_ >> 0x18;
  auVar156._0_12_ = auVar149;
  fVar351 = (float)iVar207;
  local_448._0_1_ = (char)uVar10;
  local_448._1_1_ = (char)((uint)uVar10 >> 8);
  uStack_446._0_1_ = (undefined1)((uint)uVar10 >> 0x10);
  uStack_446._1_1_ = (undefined1)((uint)uVar10 >> 0x18);
  cVar214 = cStack_4d7 >> 7;
  auVar87[0xd] = 0;
  auVar87._0_13_ = auVar156._0_13_;
  auVar87[0xe] = cVar214;
  auVar92[0xc] = cVar214;
  auVar92._0_12_ = auVar149;
  auVar92._13_2_ = auVar87._13_2_;
  auVar97[0xb] = 0;
  auVar97._0_11_ = auVar149._0_11_;
  auVar97._12_3_ = auVar92._12_3_;
  auVar103[10] = cVar214;
  auVar103._0_10_ = auVar149._0_10_;
  auVar103._11_4_ = auVar97._11_4_;
  auVar107[9] = 0;
  auVar107._0_9_ = auVar149._0_9_;
  auVar107._10_5_ = auVar103._10_5_;
  auVar111[8] = cStack_4d7;
  auVar111._0_8_ = auVar149._0_8_;
  auVar111._9_6_ = auVar107._9_6_;
  Var64 = CONCAT81(CONCAT71(auVar111._8_7_,uStack_446._1_1_),(short)local_4d8 >> 7);
  auVar115._6_9_ = Var64;
  auVar115[5] = (undefined1)uStack_446;
  auVar115[4] = (undefined1)((short)local_4d8 >> 7);
  auVar115._0_4_ = iVar286;
  auVar119._2_11_ = auVar115._4_11_;
  auVar119[1] = local_448._1_1_;
  auVar119[0] = (undefined1)((short)local_4d8 >> 7);
  auVar123._2_13_ = auVar119;
  auVar123._0_2_ = CONCAT11((char)local_448,local_4d8);
  uVar205 = (undefined2)Var64;
  auVar159._0_12_ = auVar123._0_12_;
  auVar159._12_2_ = uVar205;
  auVar159._14_2_ = uVar205;
  auVar158._12_4_ = auVar159._12_4_;
  auVar158._0_10_ = auVar123._0_10_;
  auVar158._10_2_ = auVar115._4_2_;
  auVar157._10_6_ = auVar158._10_6_;
  auVar157._0_8_ = auVar123._0_8_;
  auVar157._8_2_ = auVar115._4_2_;
  auVar72._4_8_ = auVar157._8_8_;
  auVar72._2_2_ = auVar119._0_2_;
  auVar72._0_2_ = auVar119._0_2_;
  iVar207 = (int)CONCAT11((char)local_448,local_4d8) >> 8;
  iVar208 = auVar72._0_4_ >> 0x18;
  auVar150._0_8_ = CONCAT44(iVar208,iVar207);
  auVar150._8_4_ = auVar157._8_4_ >> 0x18;
  auVar160._12_4_ = auVar158._12_4_ >> 0x18;
  auVar160._0_12_ = auVar150;
  fVar341 = (float)iVar208;
  local_428._0_1_ = (char)uVar11;
  local_428._1_1_ = (char)((uint)uVar11 >> 8);
  local_428._2_1_ = (undefined1)((uint)uVar11 >> 0x10);
  local_428._3_1_ = (undefined1)((uint)uVar11 >> 0x18);
  cVar214 = local_448._1_1_ >> 7;
  auVar88[0xd] = 0;
  auVar88._0_13_ = auVar160._0_13_;
  auVar88[0xe] = cVar214;
  auVar93[0xc] = cVar214;
  auVar93._0_12_ = auVar150;
  auVar93._13_2_ = auVar88._13_2_;
  auVar98[0xb] = 0;
  auVar98._0_11_ = auVar150._0_11_;
  auVar98._12_3_ = auVar93._12_3_;
  auVar104[10] = cVar214;
  auVar104._0_10_ = auVar150._0_10_;
  auVar104._11_4_ = auVar98._11_4_;
  auVar108[9] = 0;
  auVar108._0_9_ = auVar150._0_9_;
  auVar108._10_5_ = auVar104._10_5_;
  auVar112[8] = local_448._1_1_;
  auVar112._0_8_ = auVar150._0_8_;
  auVar112._9_6_ = auVar108._9_6_;
  Var64 = CONCAT81(CONCAT71(auVar112._8_7_,local_428._3_1_),(short)(char)local_448 >> 7);
  auVar116._6_9_ = Var64;
  auVar116[5] = local_428._2_1_;
  auVar116[4] = (undefined1)((short)(char)local_448 >> 7);
  auVar116._0_4_ = iVar207;
  auVar120._2_11_ = auVar116._4_11_;
  auVar120[1] = local_428._1_1_;
  auVar120[0] = (undefined1)((short)(char)local_448 >> 7);
  auVar124._2_13_ = auVar120;
  auVar124._0_2_ = CONCAT11((char)local_428,(char)local_448);
  uVar205 = (undefined2)Var64;
  auVar163._0_12_ = auVar124._0_12_;
  auVar163._12_2_ = uVar205;
  auVar163._14_2_ = uVar205;
  auVar162._12_4_ = auVar163._12_4_;
  auVar162._0_10_ = auVar124._0_10_;
  auVar162._10_2_ = auVar116._4_2_;
  auVar161._10_6_ = auVar162._10_6_;
  auVar161._0_8_ = auVar124._0_8_;
  auVar161._8_2_ = auVar116._4_2_;
  auVar73._4_8_ = auVar161._8_8_;
  auVar73._2_2_ = auVar120._0_2_;
  auVar73._0_2_ = auVar120._0_2_;
  iVar208 = (int)CONCAT11((char)local_428,(char)local_448) >> 8;
  iVar209 = auVar73._0_4_ >> 0x18;
  auVar151._0_8_ = CONCAT44(iVar209,iVar208);
  auVar151._8_4_ = auVar161._8_4_ >> 0x18;
  auVar164._12_4_ = auVar162._12_4_ >> 0x18;
  auVar164._0_12_ = auVar151;
  fVar319 = (float)iVar209;
  local_4f8._0_1_ = (char)uVar12;
  local_4f8._1_1_ = (char)((uint)uVar12 >> 8);
  local_4f8._2_1_ = (undefined1)((uint)uVar12 >> 0x10);
  local_4f8._3_1_ = (undefined1)((uint)uVar12 >> 0x18);
  cVar214 = local_428._1_1_ >> 7;
  auVar89[0xd] = 0;
  auVar89._0_13_ = auVar164._0_13_;
  auVar89[0xe] = cVar214;
  auVar94[0xc] = cVar214;
  auVar94._0_12_ = auVar151;
  auVar94._13_2_ = auVar89._13_2_;
  auVar99[0xb] = 0;
  auVar99._0_11_ = auVar151._0_11_;
  auVar99._12_3_ = auVar94._12_3_;
  auVar105[10] = cVar214;
  auVar105._0_10_ = auVar151._0_10_;
  auVar105._11_4_ = auVar99._11_4_;
  auVar109[9] = 0;
  auVar109._0_9_ = auVar151._0_9_;
  auVar109._10_5_ = auVar105._10_5_;
  auVar113[8] = local_428._1_1_;
  auVar113._0_8_ = auVar151._0_8_;
  auVar113._9_6_ = auVar109._9_6_;
  Var64 = CONCAT81(CONCAT71(auVar113._8_7_,local_4f8._3_1_),(short)(char)local_428 >> 7);
  auVar117._6_9_ = Var64;
  auVar117[5] = local_4f8._2_1_;
  auVar117[4] = (undefined1)((short)(char)local_428 >> 7);
  auVar117._0_4_ = iVar208;
  auVar121._2_11_ = auVar117._4_11_;
  auVar121[1] = local_4f8._1_1_;
  auVar121[0] = (undefined1)((short)(char)local_428 >> 7);
  auVar125._2_13_ = auVar121;
  auVar125._0_2_ = CONCAT11((char)local_4f8,(char)local_428);
  uVar205 = (undefined2)Var64;
  auVar167._0_12_ = auVar125._0_12_;
  auVar167._12_2_ = uVar205;
  auVar167._14_2_ = uVar205;
  auVar166._12_4_ = auVar167._12_4_;
  auVar166._0_10_ = auVar125._0_10_;
  auVar166._10_2_ = auVar117._4_2_;
  auVar165._10_6_ = auVar166._10_6_;
  auVar165._0_8_ = auVar125._0_8_;
  auVar165._8_2_ = auVar117._4_2_;
  auVar74._4_8_ = auVar165._8_8_;
  auVar74._2_2_ = auVar121._0_2_;
  auVar74._0_2_ = auVar121._0_2_;
  iVar209 = (int)CONCAT11((char)local_4f8,(char)local_428) >> 8;
  iVar210 = auVar74._0_4_ >> 0x18;
  auVar152._0_8_ = CONCAT44(iVar210,iVar209);
  auVar152._8_4_ = auVar165._8_4_ >> 0x18;
  auVar168._12_4_ = auVar166._12_4_ >> 0x18;
  auVar168._0_12_ = auVar152;
  fVar296 = (float)iVar210;
  cVar214 = local_4f8._1_1_ >> 7;
  auVar32[0xd] = 0;
  auVar32._0_13_ = auVar168._0_13_;
  auVar32[0xe] = cVar214;
  auVar36[0xc] = cVar214;
  auVar36._0_12_ = auVar152;
  auVar36._13_2_ = auVar32._13_2_;
  auVar40[0xb] = 0;
  auVar40._0_11_ = auVar152._0_11_;
  auVar40._12_3_ = auVar36._12_3_;
  auVar44[10] = cVar214;
  auVar44._0_10_ = auVar152._0_10_;
  auVar44._11_4_ = auVar40._11_4_;
  auVar48[9] = 0;
  auVar48._0_9_ = auVar152._0_9_;
  auVar48._10_5_ = auVar44._10_5_;
  auVar52[8] = local_4f8._1_1_;
  auVar52._0_8_ = auVar152._0_8_;
  auVar52._9_6_ = auVar48._9_6_;
  Var64 = CONCAT81(CONCAT71(auVar52._8_7_,(char)((uint)uVar25 >> 0x18)),(short)(char)local_4f8 >> 7)
  ;
  auVar56._6_9_ = Var64;
  auVar56[5] = (char)((uint)uVar25 >> 0x10);
  auVar56[4] = (undefined1)((short)(char)local_4f8 >> 7);
  auVar56._0_4_ = iVar209;
  auVar75._2_11_ = auVar56._4_11_;
  auVar75[1] = (char)((uint)uVar25 >> 8);
  auVar75[0] = (undefined1)((short)(char)local_4f8 >> 7);
  sVar143 = CONCAT11((char)uVar25,(char)local_4f8);
  auVar60._2_13_ = auVar75;
  auVar60._0_2_ = sVar143;
  uVar205 = (undefined2)Var64;
  auVar171._0_12_ = auVar60._0_12_;
  auVar171._12_2_ = uVar205;
  auVar171._14_2_ = uVar205;
  auVar170._12_4_ = auVar171._12_4_;
  auVar170._0_10_ = auVar60._0_10_;
  auVar170._10_2_ = auVar56._4_2_;
  auVar169._10_6_ = auVar170._10_6_;
  auVar169._0_8_ = auVar60._0_8_;
  auVar169._8_2_ = auVar56._4_2_;
  auVar76._4_8_ = auVar169._8_8_;
  auVar76._2_2_ = auVar75._0_2_;
  auVar76._0_2_ = auVar75._0_2_;
  fVar145 = (float)((int)sVar143 >> 8);
  fVar211 = (float)(auVar76._0_4_ >> 0x18);
  fVar215 = (float)(auVar169._8_4_ >> 0x18);
  fVar404 = fVar403 * (float)iVar286 + fVar410 * (float)iVar258 + fVar412 * (float)iVar259;
  fVar411 = fVar403 * fVar351 + fVar410 * fVar386 + fVar412 * fVar426;
  fVar413 = fVar403 * (float)auVar149._8_4_ +
            fVar410 * (float)auVar261._8_4_ + fVar412 * (float)auVar262._8_4_;
  fVar414 = fVar403 * (float)auVar156._12_4_ +
            fVar410 * (float)auVar267._12_4_ + fVar412 * (float)auVar271._12_4_;
  fVar390 = fVar403 * (float)iVar207 + fVar410 * (float)iVar260 + fVar144;
  fVar400 = fVar403 * fVar341 + fVar410 * fVar373 + fVar206;
  fVar401 = fVar403 * (float)auVar150._8_4_ + fVar410 * (float)auVar263._8_4_ + auVar148._8_4_;
  fVar402 = fVar403 * (float)auVar160._12_4_ + fVar410 * (float)auVar275._12_4_ + auVar174._12_4_;
  fVar323 = fVar403 * (float)iVar208 + fVar410 * (float)iVar209 + fVar412 * fVar145;
  fVar332 = fVar403 * fVar319 + fVar410 * fVar296 + fVar412 * fVar211;
  fVar334 = fVar403 * (float)auVar151._8_4_ + fVar410 * (float)auVar152._8_4_ + fVar412 * fVar215;
  fVar403 = fVar403 * (float)auVar164._12_4_ +
            fVar410 * (float)auVar168._12_4_ + fVar412 * (float)(auVar170._12_4_ >> 0x18);
  uVar218 = *(undefined8 *)(prim + uVar126 * 7 + 6);
  uVar13 = *(undefined8 *)(prim + uVar126 * 0xb + 6);
  uVar14 = *(undefined8 *)(prim + uVar126 * 9 + 6);
  fVar348 = (float)iVar286 * fVar221 + (float)iVar258 * fVar253 + (float)iVar259 * fVar255;
  fVar426 = fVar351 * fVar221 + fVar386 * fVar253 + fVar426 * fVar255;
  fVar353 = (float)auVar149._8_4_ * fVar221 +
            (float)auVar261._8_4_ * fVar253 + (float)auVar262._8_4_ * fVar255;
  fVar355 = (float)auVar156._12_4_ * fVar221 +
            (float)auVar267._12_4_ * fVar253 + (float)auVar271._12_4_ * fVar255;
  fVar357 = (float)iVar207 * fVar221 + (float)iVar260 * fVar253 + fVar306 * fVar255;
  fVar362 = fVar341 * fVar221 + fVar373 * fVar253 + fVar318 * fVar255;
  fVar364 = (float)auVar150._8_4_ * fVar221 + (float)auVar263._8_4_ * fVar253 + fVar320 * fVar255;
  fVar366 = (float)auVar160._12_4_ * fVar221 +
            (float)auVar275._12_4_ * fVar253 + (float)(auVar277._12_4_ >> 0x18) * fVar255;
  fVar351 = fVar221 * (float)iVar208 + fVar253 * (float)iVar209 + fVar255 * fVar145;
  fVar373 = fVar221 * fVar319 + fVar253 * fVar296 + fVar255 * fVar211;
  fVar386 = fVar221 * (float)auVar151._8_4_ + fVar253 * (float)auVar152._8_4_ + fVar255 * fVar215;
  fVar410 = fVar221 * (float)auVar164._12_4_ +
            fVar253 * (float)auVar168._12_4_ + fVar255 * (float)(auVar170._12_4_ >> 0x18);
  fVar412 = (float)DAT_01f4bd50;
  fVar144 = DAT_01f4bd50._4_4_;
  fVar145 = DAT_01f4bd50._8_4_;
  fVar206 = DAT_01f4bd50._12_4_;
  uVar138 = -(uint)(fVar412 <= ABS(fVar404));
  uVar139 = -(uint)(fVar144 <= ABS(fVar411));
  uVar140 = -(uint)(fVar145 <= ABS(fVar413));
  uVar141 = -(uint)(fVar206 <= ABS(fVar414));
  auVar405._0_4_ = (uint)fVar404 & uVar138;
  auVar405._4_4_ = (uint)fVar411 & uVar139;
  auVar405._8_4_ = (uint)fVar413 & uVar140;
  auVar405._12_4_ = (uint)fVar414 & uVar141;
  auVar172._0_4_ = ~uVar138 & (uint)fVar412;
  auVar172._4_4_ = ~uVar139 & (uint)fVar144;
  auVar172._8_4_ = ~uVar140 & (uint)fVar145;
  auVar172._12_4_ = ~uVar141 & (uint)fVar206;
  auVar172 = auVar172 | auVar405;
  uVar138 = -(uint)(fVar412 <= ABS(fVar390));
  uVar139 = -(uint)(fVar144 <= ABS(fVar400));
  uVar140 = -(uint)(fVar145 <= ABS(fVar401));
  uVar141 = -(uint)(fVar206 <= ABS(fVar402));
  auVar391._0_4_ = (uint)fVar390 & uVar138;
  auVar391._4_4_ = (uint)fVar400 & uVar139;
  auVar391._8_4_ = (uint)fVar401 & uVar140;
  auVar391._12_4_ = (uint)fVar402 & uVar141;
  auVar307._0_4_ = ~uVar138 & (uint)fVar412;
  auVar307._4_4_ = ~uVar139 & (uint)fVar144;
  auVar307._8_4_ = ~uVar140 & (uint)fVar145;
  auVar307._12_4_ = ~uVar141 & (uint)fVar206;
  auVar307 = auVar307 | auVar391;
  uVar138 = -(uint)(fVar412 <= ABS(fVar323));
  uVar139 = -(uint)(fVar144 <= ABS(fVar332));
  uVar140 = -(uint)(fVar145 <= ABS(fVar334));
  uVar141 = -(uint)(fVar206 <= ABS(fVar403));
  auVar325._0_4_ = (uint)fVar323 & uVar138;
  auVar325._4_4_ = (uint)fVar332 & uVar139;
  auVar325._8_4_ = (uint)fVar334 & uVar140;
  auVar325._12_4_ = (uint)fVar403 & uVar141;
  auVar381._0_4_ = ~uVar138 & (uint)fVar412;
  auVar381._4_4_ = ~uVar139 & (uint)fVar144;
  auVar381._8_4_ = ~uVar140 & (uint)fVar145;
  auVar381._12_4_ = ~uVar141 & (uint)fVar206;
  auVar381 = auVar381 | auVar325;
  auVar223 = rcpps(_DAT_01f4bd50,auVar172);
  auVar224._0_4_ = auVar223._0_4_;
  auVar173._0_4_ = auVar172._0_4_ * auVar224._0_4_;
  fVar334 = auVar223._4_4_;
  auVar173._4_4_ = auVar172._4_4_ * fVar334;
  fVar403 = auVar223._8_4_;
  auVar173._8_4_ = auVar172._8_4_ * fVar403;
  fVar341 = auVar223._12_4_;
  auVar173._12_4_ = auVar172._12_4_ * fVar341;
  fVar390 = (1.0 - auVar173._0_4_) * auVar224._0_4_ + auVar224._0_4_;
  fVar334 = (1.0 - auVar173._4_4_) * fVar334 + fVar334;
  fVar403 = (1.0 - auVar173._8_4_) * fVar403 + fVar403;
  fVar341 = (1.0 - auVar173._12_4_) * fVar341 + fVar341;
  auVar174 = rcpps(auVar173,auVar307);
  fVar412 = auVar174._0_4_;
  fVar144 = auVar174._4_4_;
  fVar255 = auVar174._8_4_;
  fVar323 = auVar174._12_4_;
  fVar412 = (1.0 - auVar307._0_4_ * fVar412) * fVar412 + fVar412;
  fVar144 = (1.0 - auVar307._4_4_ * fVar144) * fVar144 + fVar144;
  fVar255 = (1.0 - auVar307._8_4_ * fVar255) * fVar255 + fVar255;
  fVar323 = (1.0 - auVar307._12_4_ * fVar323) * fVar323 + fVar323;
  auVar174 = rcpps(auVar174,auVar381);
  auVar175._0_4_ = auVar174._0_4_;
  fVar145 = auVar174._4_4_;
  fVar296 = auVar174._8_4_;
  fVar332 = auVar174._12_4_;
  fVar400 = (1.0 - auVar381._0_4_ * auVar175._0_4_) * auVar175._0_4_ + auVar175._0_4_;
  fVar145 = (1.0 - auVar381._4_4_ * fVar145) * fVar145 + fVar145;
  fVar296 = (1.0 - auVar381._8_4_ * fVar296) * fVar296 + fVar296;
  fVar332 = (1.0 - auVar381._12_4_ * fVar332) * fVar332 + fVar332;
  local_448 = (short)uVar218;
  uStack_446 = (undefined2)((ulong)uVar218 >> 0x10);
  uStack_444 = (undefined2)((ulong)uVar218 >> 0x20);
  uStack_442 = (undefined2)((ulong)uVar218 >> 0x30);
  auVar178._0_12_ = auVar174._0_12_;
  auVar178._12_2_ = auVar174._6_2_;
  auVar178._14_2_ = uStack_442;
  auVar177._12_4_ = auVar178._12_4_;
  auVar177._0_10_ = auVar174._0_10_;
  auVar177._10_2_ = uStack_444;
  auVar176._10_6_ = auVar177._10_6_;
  auVar176._0_8_ = auVar174._0_8_;
  auVar176._8_2_ = auVar174._4_2_;
  auVar175._8_8_ = auVar176._8_8_;
  auVar175._6_2_ = uStack_446;
  auVar175._4_2_ = auVar174._2_2_;
  auVar179._0_4_ = (float)(int)local_448;
  fVar206 = (float)(auVar175._4_4_ >> 0x10);
  auVar153._0_8_ = CONCAT44(fVar206,auVar179._0_4_);
  auVar153._8_4_ = (float)(auVar176._8_4_ >> 0x10);
  local_428._0_2_ = (short)uVar13;
  local_428._2_2_ = (undefined2)((ulong)uVar13 >> 0x10);
  uStack_424 = (undefined2)((ulong)uVar13 >> 0x20);
  uStack_422 = (undefined2)((ulong)uVar13 >> 0x30);
  auVar227._0_12_ = auVar223._0_12_;
  auVar227._12_2_ = auVar223._6_2_;
  auVar227._14_2_ = uStack_422;
  auVar226._12_4_ = auVar227._12_4_;
  auVar226._0_10_ = auVar223._0_10_;
  auVar226._10_2_ = uStack_424;
  auVar225._10_6_ = auVar226._10_6_;
  auVar225._0_8_ = auVar223._0_8_;
  auVar225._8_2_ = auVar223._4_2_;
  auVar224._8_8_ = auVar225._8_8_;
  auVar224._6_2_ = local_428._2_2_;
  auVar224._4_2_ = auVar223._2_2_;
  auVar182._12_2_ = (short)((uint)fVar206 >> 0x10);
  auVar182._0_12_ = auVar153;
  auVar182._14_2_ = (short)((ulong)uVar14 >> 0x30);
  auVar181._12_4_ = auVar182._12_4_;
  auVar181._0_10_ = auVar153._0_10_;
  auVar181._10_2_ = (short)((ulong)uVar14 >> 0x20);
  auVar180._10_6_ = auVar181._10_6_;
  auVar180._8_2_ = SUB42(fVar206,0);
  auVar180._0_8_ = auVar153._0_8_;
  auVar179._8_8_ = auVar180._8_8_;
  auVar179._6_2_ = (short)((ulong)uVar14 >> 0x10);
  auVar179._4_2_ = (short)((uint)auVar179._0_4_ >> 0x10);
  fVar211 = (float)(auVar179._4_4_ >> 0x10);
  fVar306 = (float)(auVar180._8_4_ >> 0x10);
  uVar134 = *(ulong *)(prim + uVar126 * 0xd + 6);
  uVar205 = (undefined2)(uVar134 >> 0x30);
  auVar230._8_4_ = 0;
  auVar230._0_8_ = uVar134;
  auVar230._12_2_ = uVar205;
  auVar230._14_2_ = uVar205;
  uVar205 = (undefined2)(uVar134 >> 0x20);
  auVar229._12_4_ = auVar230._12_4_;
  auVar229._8_2_ = 0;
  auVar229._0_8_ = uVar134;
  auVar229._10_2_ = uVar205;
  auVar228._10_6_ = auVar229._10_6_;
  auVar228._8_2_ = uVar205;
  auVar228._0_8_ = uVar134;
  uVar205 = (undefined2)(uVar134 >> 0x10);
  auVar77._4_8_ = auVar228._8_8_;
  auVar77._2_2_ = uVar205;
  auVar77._0_2_ = uVar205;
  uVar135 = *(ulong *)(prim + uVar126 * 0x12 + 6);
  uVar205 = (undefined2)(uVar135 >> 0x30);
  auVar185._8_4_ = 0;
  auVar185._0_8_ = uVar135;
  auVar185._12_2_ = uVar205;
  auVar185._14_2_ = uVar205;
  uVar205 = (undefined2)(uVar135 >> 0x20);
  auVar184._12_4_ = auVar185._12_4_;
  auVar184._8_2_ = 0;
  auVar184._0_8_ = uVar135;
  auVar184._10_2_ = uVar205;
  auVar183._10_6_ = auVar184._10_6_;
  auVar183._8_2_ = uVar205;
  auVar183._0_8_ = uVar135;
  uVar205 = (undefined2)(uVar135 >> 0x10);
  auVar78._4_8_ = auVar183._8_8_;
  auVar78._2_2_ = uVar205;
  auVar78._0_2_ = uVar205;
  fVar215 = (float)(auVar78._0_4_ >> 0x10);
  fVar318 = (float)(auVar183._8_4_ >> 0x10);
  uVar131 = *(ulong *)(prim + uVar126 * 0x16 + 6);
  uVar205 = (undefined2)(uVar131 >> 0x30);
  auVar233._8_4_ = 0;
  auVar233._0_8_ = uVar131;
  auVar233._12_2_ = uVar205;
  auVar233._14_2_ = uVar205;
  uVar205 = (undefined2)(uVar131 >> 0x20);
  auVar232._12_4_ = auVar233._12_4_;
  auVar232._8_2_ = 0;
  auVar232._0_8_ = uVar131;
  auVar232._10_2_ = uVar205;
  auVar231._10_6_ = auVar232._10_6_;
  auVar231._8_2_ = uVar205;
  auVar231._0_8_ = uVar131;
  uVar205 = (undefined2)(uVar131 >> 0x10);
  auVar79._4_8_ = auVar231._8_8_;
  auVar79._2_2_ = uVar205;
  auVar79._0_2_ = uVar205;
  uVar15 = *(ulong *)(prim + uVar126 * 0x14 + 6);
  uVar205 = (undefined2)(uVar15 >> 0x30);
  auVar188._8_4_ = 0;
  auVar188._0_8_ = uVar15;
  auVar188._12_2_ = uVar205;
  auVar188._14_2_ = uVar205;
  uVar205 = (undefined2)(uVar15 >> 0x20);
  auVar187._12_4_ = auVar188._12_4_;
  auVar187._8_2_ = 0;
  auVar187._0_8_ = uVar15;
  auVar187._10_2_ = uVar205;
  auVar186._10_6_ = auVar187._10_6_;
  auVar186._8_2_ = uVar205;
  auVar186._0_8_ = uVar15;
  uVar205 = (undefined2)(uVar15 >> 0x10);
  auVar80._4_8_ = auVar186._8_8_;
  auVar80._2_2_ = uVar205;
  auVar80._0_2_ = uVar205;
  fVar221 = (float)(auVar80._0_4_ >> 0x10);
  fVar319 = (float)(auVar186._8_4_ >> 0x10);
  uVar16 = *(ulong *)(prim + uVar126 * 0x18 + 6);
  uVar205 = (undefined2)(uVar16 >> 0x30);
  auVar236._8_4_ = 0;
  auVar236._0_8_ = uVar16;
  auVar236._12_2_ = uVar205;
  auVar236._14_2_ = uVar205;
  uVar205 = (undefined2)(uVar16 >> 0x20);
  auVar235._12_4_ = auVar236._12_4_;
  auVar235._8_2_ = 0;
  auVar235._0_8_ = uVar16;
  auVar235._10_2_ = uVar205;
  auVar234._10_6_ = auVar235._10_6_;
  auVar234._8_2_ = uVar205;
  auVar234._0_8_ = uVar16;
  uVar205 = (undefined2)(uVar16 >> 0x10);
  auVar81._4_8_ = auVar234._8_8_;
  auVar81._2_2_ = uVar205;
  auVar81._0_2_ = uVar205;
  uVar17 = *(ulong *)(prim + uVar126 * 0x1d + 6);
  uVar205 = (undefined2)(uVar17 >> 0x30);
  auVar191._8_4_ = 0;
  auVar191._0_8_ = uVar17;
  auVar191._12_2_ = uVar205;
  auVar191._14_2_ = uVar205;
  uVar205 = (undefined2)(uVar17 >> 0x20);
  auVar190._12_4_ = auVar191._12_4_;
  auVar190._8_2_ = 0;
  auVar190._0_8_ = uVar17;
  auVar190._10_2_ = uVar205;
  auVar189._10_6_ = auVar190._10_6_;
  auVar189._8_2_ = uVar205;
  auVar189._0_8_ = uVar17;
  uVar205 = (undefined2)(uVar17 >> 0x10);
  auVar82._4_8_ = auVar189._8_8_;
  auVar82._2_2_ = uVar205;
  auVar82._0_2_ = uVar205;
  fVar253 = (float)(auVar82._0_4_ >> 0x10);
  fVar320 = (float)(auVar189._8_4_ >> 0x10);
  uVar18 = *(ulong *)(prim + uVar126 * 0x21 + 6);
  uVar205 = (undefined2)(uVar18 >> 0x30);
  auVar239._8_4_ = 0;
  auVar239._0_8_ = uVar18;
  auVar239._12_2_ = uVar205;
  auVar239._14_2_ = uVar205;
  uVar205 = (undefined2)(uVar18 >> 0x20);
  auVar238._12_4_ = auVar239._12_4_;
  auVar238._8_2_ = 0;
  auVar238._0_8_ = uVar18;
  auVar238._10_2_ = uVar205;
  auVar237._10_6_ = auVar238._10_6_;
  auVar237._8_2_ = uVar205;
  auVar237._0_8_ = uVar18;
  uVar205 = (undefined2)(uVar18 >> 0x10);
  auVar83._4_8_ = auVar237._8_8_;
  auVar83._2_2_ = uVar205;
  auVar83._0_2_ = uVar205;
  uVar19 = *(ulong *)(prim + uVar126 * 0x1f + 6);
  uVar205 = (undefined2)(uVar19 >> 0x30);
  auVar194._8_4_ = 0;
  auVar194._0_8_ = uVar19;
  auVar194._12_2_ = uVar205;
  auVar194._14_2_ = uVar205;
  uVar205 = (undefined2)(uVar19 >> 0x20);
  auVar193._12_4_ = auVar194._12_4_;
  auVar193._8_2_ = 0;
  auVar193._0_8_ = uVar19;
  auVar193._10_2_ = uVar205;
  auVar192._10_6_ = auVar193._10_6_;
  auVar192._8_2_ = uVar205;
  auVar192._0_8_ = uVar19;
  uVar205 = (undefined2)(uVar19 >> 0x10);
  auVar84._4_8_ = auVar192._8_8_;
  auVar84._2_2_ = uVar205;
  auVar84._0_2_ = uVar205;
  fVar401 = (float)(auVar84._0_4_ >> 0x10);
  fVar402 = (float)(auVar192._8_4_ >> 0x10);
  uVar126 = *(ulong *)(prim + uVar126 * 0x23 + 6);
  uVar205 = (undefined2)(uVar126 >> 0x30);
  auVar197._8_4_ = 0;
  auVar197._0_8_ = uVar126;
  auVar197._12_2_ = uVar205;
  auVar197._14_2_ = uVar205;
  uVar205 = (undefined2)(uVar126 >> 0x20);
  auVar196._12_4_ = auVar197._12_4_;
  auVar196._8_2_ = 0;
  auVar196._0_8_ = uVar126;
  auVar196._10_2_ = uVar205;
  auVar195._10_6_ = auVar196._10_6_;
  auVar195._8_2_ = uVar205;
  auVar195._0_8_ = uVar126;
  uVar205 = (undefined2)(uVar126 >> 0x10);
  auVar85._4_8_ = auVar195._8_8_;
  auVar85._2_2_ = uVar205;
  auVar85._0_2_ = uVar205;
  uVar133 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar308._0_8_ =
       CONCAT44(((((float)(auVar224._4_4_ >> 0x10) - fVar206) * fVar415 + fVar206) - fVar426) *
                fVar334,((((float)(int)(short)local_428 - auVar179._0_4_) * fVar415 + auVar179._0_4_
                         ) - fVar348) * fVar390);
  auVar308._8_4_ =
       ((((float)(auVar225._8_4_ >> 0x10) - auVar153._8_4_) * fVar415 + auVar153._8_4_) - fVar353) *
       fVar403;
  auVar308._12_4_ =
       ((((float)(auVar226._12_4_ >> 0x10) - (float)(auVar177._12_4_ >> 0x10)) * fVar415 +
        (float)(auVar177._12_4_ >> 0x10)) - fVar355) * fVar341;
  auVar359._0_4_ =
       ((((float)(int)(short)uVar134 - (float)(int)(short)uVar14) * fVar415 +
        (float)(int)(short)uVar14) - fVar348) * fVar390;
  auVar359._4_4_ =
       ((((float)(auVar77._0_4_ >> 0x10) - fVar211) * fVar415 + fVar211) - fVar426) * fVar334;
  auVar359._8_4_ =
       ((((float)(auVar228._8_4_ >> 0x10) - fVar306) * fVar415 + fVar306) - fVar353) * fVar403;
  auVar359._12_4_ =
       ((((float)(auVar229._12_4_ >> 0x10) - (float)(auVar181._12_4_ >> 0x10)) * fVar415 +
        (float)(auVar181._12_4_ >> 0x10)) - fVar355) * fVar341;
  auVar368._0_8_ =
       CONCAT44(((((float)(auVar79._0_4_ >> 0x10) - fVar215) * fVar415 + fVar215) - fVar362) *
                fVar144,((((float)(int)(short)uVar131 - (float)(int)(short)uVar135) * fVar415 +
                         (float)(int)(short)uVar135) - fVar357) * fVar412);
  auVar368._8_4_ =
       ((((float)(auVar231._8_4_ >> 0x10) - fVar318) * fVar415 + fVar318) - fVar364) * fVar255;
  auVar368._12_4_ =
       ((((float)(auVar232._12_4_ >> 0x10) - (float)(auVar184._12_4_ >> 0x10)) * fVar415 +
        (float)(auVar184._12_4_ >> 0x10)) - fVar366) * fVar323;
  aVar372._0_4_ =
       ((((float)(int)(short)uVar16 - (float)(int)(short)uVar15) * fVar415 +
        (float)(int)(short)uVar15) - fVar357) * fVar412;
  aVar372._4_4_ =
       ((((float)(auVar81._0_4_ >> 0x10) - fVar221) * fVar415 + fVar221) - fVar362) * fVar144;
  aVar372._8_4_ =
       ((((float)(auVar234._8_4_ >> 0x10) - fVar319) * fVar415 + fVar319) - fVar364) * fVar255;
  aVar372._12_4_ =
       ((((float)(auVar235._12_4_ >> 0x10) - (float)(auVar187._12_4_ >> 0x10)) * fVar415 +
        (float)(auVar187._12_4_ >> 0x10)) - fVar366) * fVar323;
  auVar382._0_8_ =
       CONCAT44(((((float)(auVar83._0_4_ >> 0x10) - fVar253) * fVar415 + fVar253) - fVar373) *
                fVar145,((((float)(int)(short)uVar18 - (float)(int)(short)uVar17) * fVar415 +
                         (float)(int)(short)uVar17) - fVar351) * fVar400);
  auVar382._8_4_ =
       ((((float)(auVar237._8_4_ >> 0x10) - fVar320) * fVar415 + fVar320) - fVar386) * fVar296;
  auVar382._12_4_ =
       ((((float)(auVar238._12_4_ >> 0x10) - (float)(auVar190._12_4_ >> 0x10)) * fVar415 +
        (float)(auVar190._12_4_ >> 0x10)) - fVar410) * fVar332;
  aVar392._0_4_ =
       ((((float)(int)(short)uVar126 - (float)(int)(short)uVar19) * fVar415 +
        (float)(int)(short)uVar19) - fVar351) * fVar400;
  aVar392._4_4_ =
       ((((float)(auVar85._0_4_ >> 0x10) - fVar401) * fVar415 + fVar401) - fVar373) * fVar145;
  aVar392._8_4_ =
       ((((float)(auVar195._8_4_ >> 0x10) - fVar402) * fVar415 + fVar402) - fVar386) * fVar296;
  aVar392._12_4_ =
       ((((float)(auVar196._12_4_ >> 0x10) - (float)(auVar193._12_4_ >> 0x10)) * fVar415 +
        (float)(auVar193._12_4_ >> 0x10)) - fVar410) * fVar332;
  auVar291._8_4_ = auVar308._8_4_;
  auVar291._0_8_ = auVar308._0_8_;
  auVar291._12_4_ = auVar308._12_4_;
  auVar223 = minps(auVar291,auVar359);
  auVar279._8_4_ = auVar368._8_4_;
  auVar279._0_8_ = auVar368._0_8_;
  auVar279._12_4_ = auVar368._12_4_;
  auVar174 = minps(auVar279,(undefined1  [16])aVar372);
  auVar223 = maxps(auVar223,auVar174);
  auVar280._8_4_ = auVar382._8_4_;
  auVar280._0_8_ = auVar382._0_8_;
  auVar280._12_4_ = auVar382._12_4_;
  auVar174 = minps(auVar280,(undefined1  [16])aVar392);
  auVar240._4_4_ = uVar133;
  auVar240._0_4_ = uVar133;
  auVar240._8_4_ = uVar133;
  auVar240._12_4_ = uVar133;
  auVar174 = maxps(auVar174,auVar240);
  auVar174 = maxps(auVar223,auVar174);
  fVar412 = auVar174._0_4_ * 0.99999964;
  fVar144 = auVar174._4_4_ * 0.99999964;
  fVar145 = auVar174._8_4_ * 0.99999964;
  fVar206 = auVar174._12_4_ * 0.99999964;
  auVar174 = maxps(auVar308,auVar359);
  auVar223 = maxps(auVar368,(undefined1  [16])aVar372);
  auVar174 = minps(auVar174,auVar223);
  auVar223 = maxps(auVar382,(undefined1  [16])aVar392);
  uVar133 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar241._4_4_ = uVar133;
  auVar241._0_4_ = uVar133;
  auVar241._8_4_ = uVar133;
  auVar241._12_4_ = uVar133;
  aVar383 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)minps(auVar223,auVar241);
  auVar174 = minps(auVar174,(undefined1  [16])aVar383);
  auVar242._0_4_ = -(uint)(PVar20 != (Primitive)0x0 && fVar412 <= auVar174._0_4_ * 1.0000004);
  auVar242._4_4_ = -(uint)(1 < (byte)PVar20 && fVar144 <= auVar174._4_4_ * 1.0000004);
  auVar242._8_4_ = -(uint)(2 < (byte)PVar20 && fVar145 <= auVar174._8_4_ * 1.0000004);
  auVar242._12_4_ = -(uint)(3 < (byte)PVar20 && fVar206 <= auVar174._12_4_ * 1.0000004);
  uVar133 = movmskps((int)unaff_RBP,auVar242);
  local_398 = mm_lookupmask_ps._0_8_;
  uStack_390 = mm_lookupmask_ps._8_8_;
  local_340 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_3b0 = pre;
  local_3a0 = context;
  local_48 = fVar412;
  fStack_44 = fVar144;
  fStack_40 = fVar145;
  fStack_3c = fVar206;
  for (uVar134 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),uVar133); uVar134 != 0;
      uVar134 = (ulong)((uint)uVar134 & (uint)uVar134 + 0xf & uVar138)) {
    lVar129 = 0;
    if (uVar134 != 0) {
      for (; (uVar134 >> lVar129 & 1) == 0; lVar129 = lVar129 + 1) {
      }
    }
    local_3a8 = (ulong)*(uint *)(prim + 2);
    uVar138 = *(uint *)(prim + lVar129 * 4 + 6);
    pGVar26 = (context->scene->geometries).items[local_3a8].ptr;
    uVar135 = (ulong)*(uint *)(*(long *)&pGVar26->field_0x58 +
                              (ulong)uVar138 *
                              pGVar26[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i);
    fVar211 = pGVar26->fnumTimeSegments;
    fVar215 = (pGVar26->time_range).lower;
    fVar221 = ((*(float *)(ray + k * 4 + 0x70) - fVar215) / ((pGVar26->time_range).upper - fVar215))
              * fVar211;
    fVar215 = floorf(fVar221);
    context = local_3a0;
    fVar211 = fVar211 + -1.0;
    if (fVar211 <= fVar215) {
      fVar215 = fVar211;
    }
    fVar211 = 0.0;
    if (0.0 <= fVar215) {
      fVar211 = fVar215;
    }
    _Var27 = pGVar26[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar137 = (long)(int)fVar211 * 0x38;
    lVar129 = *(long *)(_Var27 + lVar137);
    lVar132 = *(long *)(_Var27 + 0x10 + lVar137);
    uVar131 = *(ulong *)(_Var27 + 0x38 + lVar137);
    lVar137 = *(long *)(_Var27 + 0x48 + lVar137);
    pRVar130 = (RTCIntersectArguments *)(lVar132 * (uVar135 + 3));
    pfVar1 = (float *)(uVar131 + uVar135 * lVar137);
    pfVar2 = (float *)(lVar129 + lVar132 * uVar135);
    pfVar3 = (float *)(uVar131 + (uVar135 + 1) * lVar137);
    pfVar4 = (float *)(lVar129 + lVar132 * (uVar135 + 1));
    pfVar5 = (float *)(uVar131 + (uVar135 + 2) * lVar137);
    pfVar6 = (float *)(lVar129 + lVar132 * (uVar135 + 2));
    fVar221 = fVar221 - fVar211;
    fVar211 = 1.0 - fVar221;
    fVar400 = *pfVar2 * fVar211 + *pfVar1 * fVar221;
    fVar426 = pfVar2[1] * fVar211 + pfVar1[1] * fVar221;
    fVar353 = pfVar2[2] * fVar211 + pfVar1[2] * fVar221;
    fVar355 = pfVar2[3] * fVar211 + pfVar1[3] * fVar221;
    fVar413 = *pfVar4 * fVar211 + *pfVar3 * fVar221;
    fVar414 = pfVar4[1] * fVar211 + pfVar3[1] * fVar221;
    fVar415 = pfVar4[2] * fVar211 + pfVar3[2] * fVar221;
    fVar434 = pfVar4[3] * fVar211 + pfVar3[3] * fVar221;
    pfVar1 = (float *)(uVar131 + lVar137 * (uVar135 + 3));
    pfVar2 = (float *)((long)&pRVar130->flags + lVar129);
    fVar357 = *pfVar6 * fVar211 + *pfVar5 * fVar221;
    fVar362 = pfVar6[1] * fVar211 + pfVar5[1] * fVar221;
    fVar364 = pfVar6[2] * fVar211 + pfVar5[2] * fVar221;
    fVar366 = pfVar6[3] * fVar211 + pfVar5[3] * fVar221;
    fVar401 = fVar211 * *pfVar2 + fVar221 * *pfVar1;
    fVar402 = fVar211 * pfVar2[1] + fVar221 * pfVar1[1];
    fVar404 = fVar211 * pfVar2[2] + fVar221 * pfVar1[2];
    fVar411 = fVar211 * pfVar2[3] + fVar221 * pfVar1[3];
    iVar286 = (int)pGVar26[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    fVar211 = *(float *)(ray + k * 4);
    fVar215 = *(float *)(ray + k * 4 + 0x10);
    fVar221 = *(float *)(ray + k * 4 + 0x20);
    fVar334 = fVar400 - fVar211;
    fVar403 = fVar426 - fVar215;
    fVar341 = fVar353 - fVar221;
    fVar253 = pre->ray_space[k].vx.field_0.m128[0];
    fVar255 = pre->ray_space[k].vx.field_0.m128[1];
    fVar296 = pre->ray_space[k].vx.field_0.m128[2];
    fVar306 = pre->ray_space[k].vy.field_0.m128[0];
    fVar318 = pre->ray_space[k].vy.field_0.m128[1];
    fVar319 = pre->ray_space[k].vy.field_0.m128[2];
    fVar320 = pre->ray_space[k].vz.field_0.m128[0];
    fVar323 = pre->ray_space[k].vz.field_0.m128[1];
    fVar332 = pre->ray_space[k].vz.field_0.m128[2];
    fVar351 = fVar334 * fVar253 + fVar403 * fVar306 + fVar341 * fVar320;
    fVar386 = fVar334 * fVar255 + fVar403 * fVar318 + fVar341 * fVar323;
    fVar410 = fVar334 * fVar296 + fVar403 * fVar319 + fVar341 * fVar332;
    fVar334 = fVar413 - fVar211;
    fVar403 = fVar414 - fVar215;
    fVar341 = fVar415 - fVar221;
    fVar373 = fVar334 * fVar253 + fVar403 * fVar306 + fVar341 * fVar320;
    local_378 = fVar334 * fVar255 + fVar403 * fVar318 + fVar341 * fVar323;
    fVar390 = fVar334 * fVar296 + fVar403 * fVar319 + fVar341 * fVar332;
    fVar334 = fVar357 - fVar211;
    fVar403 = fVar362 - fVar215;
    fVar341 = fVar364 - fVar221;
    fVar348 = fVar334 * fVar253 + fVar403 * fVar306 + fVar341 * fVar320;
    local_358 = fVar334 * fVar255 + fVar403 * fVar318 + fVar341 * fVar323;
    local_368 = fVar334 * fVar296 + fVar403 * fVar319 + fVar341 * fVar332;
    fVar211 = fVar401 - fVar211;
    fVar215 = fVar402 - fVar215;
    fVar221 = fVar404 - fVar221;
    fVar253 = fVar211 * fVar253 + fVar215 * fVar306 + fVar221 * fVar320;
    fVar255 = fVar211 * fVar255 + fVar215 * fVar318 + fVar221 * fVar323;
    fVar215 = fVar211 * fVar296 + fVar215 * fVar319 + fVar221 * fVar332;
    auVar393._0_8_ = CONCAT44(fVar386,fVar351) & 0x7fffffff7fffffff;
    auVar393._8_4_ = ABS(fVar410);
    auVar393._12_4_ = ABS(fVar355);
    auVar309._0_8_ = CONCAT44(local_378,fVar373) & 0x7fffffff7fffffff;
    auVar309._8_4_ = ABS(fVar390);
    auVar309._12_4_ = ABS(fVar434);
    auVar223 = maxps(auVar393,auVar309);
    auVar326._0_8_ = CONCAT44(local_358,fVar348) & 0x7fffffff7fffffff;
    auVar326._8_4_ = ABS(local_368);
    auVar326._12_4_ = ABS(fVar366);
    auVar243._0_8_ = CONCAT44(fVar255,fVar253) & 0x7fffffff7fffffff;
    auVar243._8_4_ = ABS(fVar215);
    auVar243._12_4_ = ABS(fVar411);
    auVar174 = maxps(auVar326,auVar243);
    auVar174 = maxps(auVar223,auVar174);
    uVar218 = auVar174._8_8_;
    fVar211 = auVar174._4_4_;
    if (auVar174._4_4_ <= auVar174._0_4_) {
      fVar211 = auVar174._0_4_;
    }
    fVar221 = (float)iVar286;
    auVar394._8_8_ = uVar218;
    auVar394._0_8_ = uVar218;
    if (auVar174._8_4_ <= fVar211) {
      auVar395._4_12_ = auVar394._4_12_;
      auVar395._0_4_ = fVar211;
      uVar218 = auVar395._0_8_;
    }
    lVar129 = (long)iVar286 * 0x44;
    fVar296 = *(float *)(bspline_basis0 + lVar129 + 0x908);
    fVar306 = *(float *)(bspline_basis0 + lVar129 + 0x90c);
    fVar318 = *(float *)(bspline_basis0 + lVar129 + 0x910);
    fVar319 = *(float *)(bspline_basis0 + lVar129 + 0x914);
    fVar211 = *(float *)*(undefined1 (*) [12])(bspline_basis0 + lVar129 + 0xd8c);
    fVar320 = *(float *)(bspline_basis0 + lVar129 + 0xd90);
    fVar323 = *(float *)(bspline_basis0 + lVar129 + 0xd94);
    auVar63 = *(undefined1 (*) [12])(bspline_basis0 + lVar129 + 0xd8c);
    fVar332 = *(float *)(bspline_basis0 + lVar129 + 0xd98);
    fVar334 = *(float *)(bspline_basis0 + lVar129 + 0x484);
    fVar403 = *(float *)(bspline_basis0 + lVar129 + 0x488);
    fVar341 = *(float *)(bspline_basis0 + lVar129 + 0x48c);
    fVar338 = *(float *)(bspline_basis0 + lVar129 + 0x490);
    local_388 = *(float *)(bspline_basis0 + lVar129);
    fStack_384 = *(float *)(bspline_basis0 + lVar129 + 4);
    fStack_380 = *(float *)(bspline_basis0 + lVar129 + 8);
    fStack_37c = *(float *)(bspline_basis0 + lVar129 + 0xc);
    fVar288 = fVar351 * local_388 + fVar373 * fVar334 + fVar348 * fVar296 + fVar253 * fVar211;
    fVar297 = fVar351 * fStack_384 + fVar373 * fVar403 + fVar348 * fVar306 + fVar253 * fVar320;
    fVar300 = fVar351 * fStack_380 + fVar373 * fVar341 + fVar348 * fVar318 + fVar253 * fVar323;
    fVar303 = fVar351 * fStack_37c + fVar373 * fVar338 + fVar348 * fVar319 + fVar253 * fVar332;
    fVar423 = fVar386 * local_388 + local_378 * fVar334 + local_358 * fVar296 + fVar255 * fVar211;
    fVar427 = fVar386 * fStack_384 + local_378 * fVar403 + local_358 * fVar306 + fVar255 * fVar320;
    fVar431 = fVar386 * fStack_380 + local_378 * fVar341 + local_358 * fVar318 + fVar255 * fVar323;
    fVar435 = fVar386 * fStack_37c + local_378 * fVar338 + local_358 * fVar319 + fVar255 * fVar332;
    fVar324 = fVar355 * local_388 + fVar434 * fVar334 + fVar366 * fVar296 + fVar411 * fVar211;
    fVar333 = fVar355 * fStack_384 + fVar434 * fVar403 + fVar366 * fVar306 + fVar411 * fVar320;
    auVar360._4_4_ = fVar333;
    auVar360._0_4_ = fVar324;
    fVar335 = fVar355 * fStack_380 + fVar434 * fVar341 + fVar366 * fVar318 + fVar411 * fVar323;
    fVar336 = fVar355 * fStack_37c + fVar434 * fVar338 + fVar366 * fVar319 + fVar411 * fVar332;
    fVar211 = *(float *)*(undefined1 (*) [12])(bspline_basis1 + lVar129 + 0xd8c);
    fVar320 = *(float *)(bspline_basis1 + lVar129 + 0xd90);
    fVar323 = *(float *)(bspline_basis1 + lVar129 + 0xd94);
    auVar66 = *(undefined1 (*) [12])(bspline_basis1 + lVar129 + 0xd8c);
    fVar343 = *(float *)(bspline_basis1 + lVar129 + 0xd98);
    fVar345 = *(float *)(bspline_basis1 + lVar129 + 0x908);
    fVar347 = *(float *)(bspline_basis1 + lVar129 + 0x90c);
    fVar290 = *(float *)(bspline_basis1 + lVar129 + 0x910);
    fVar358 = *(float *)(bspline_basis1 + lVar129 + 0x914);
    fVar299 = *(float *)(bspline_basis1 + lVar129 + 0x484);
    fVar363 = *(float *)(bspline_basis1 + lVar129 + 0x488);
    fVar302 = *(float *)(bspline_basis1 + lVar129 + 0x48c);
    fVar365 = *(float *)(bspline_basis1 + lVar129 + 0x490);
    fVar305 = *(float *)(bspline_basis1 + lVar129);
    fVar367 = *(float *)(bspline_basis1 + lVar129 + 4);
    fVar425 = *(float *)(bspline_basis1 + lVar129 + 8);
    fVar430 = *(float *)(bspline_basis1 + lVar129 + 0xc);
    fVar349 = fVar351 * fVar305 + fVar373 * fVar299 + fVar348 * fVar345 + fVar253 * fVar211;
    fVar352 = fVar351 * fVar367 + fVar373 * fVar363 + fVar348 * fVar347 + fVar253 * fVar320;
    fVar354 = fVar351 * fVar425 + fVar373 * fVar302 + fVar348 * fVar290 + fVar253 * fVar323;
    fVar356 = fVar351 * fVar430 + fVar373 * fVar365 + fVar348 * fVar358 + fVar253 * fVar343;
    fVar146 = fVar386 * fVar305 + local_378 * fVar299 + local_358 * fVar345 + fVar255 * fVar211;
    fVar212 = fVar386 * fVar367 + local_378 * fVar363 + local_358 * fVar347 + fVar255 * fVar320;
    fVar216 = fVar386 * fVar425 + local_378 * fVar302 + local_358 * fVar290 + fVar255 * fVar323;
    fVar219 = fVar386 * fVar430 + local_378 * fVar365 + local_358 * fVar358 + fVar255 * fVar343;
    auVar396._0_4_ = fVar355 * fVar305 + fVar434 * fVar299 + fVar366 * fVar345 + fVar411 * fVar211;
    auVar396._4_4_ = fVar355 * fVar367 + fVar434 * fVar363 + fVar366 * fVar347 + fVar411 * fVar320;
    auVar396._8_4_ = fVar355 * fVar425 + fVar434 * fVar302 + fVar366 * fVar290 + fVar411 * fVar323;
    auVar396._12_4_ = fVar355 * fVar430 + fVar434 * fVar365 + fVar366 * fVar358 + fVar411 * fVar343;
    fVar337 = fVar349 - fVar288;
    fVar342 = fVar352 - fVar297;
    fVar344 = fVar354 - fVar300;
    fVar346 = fVar356 - fVar303;
    fVar320 = fVar146 - fVar423;
    fVar323 = fVar212 - fVar427;
    fVar321 = fVar216 - fVar431;
    fVar322 = fVar219 - fVar435;
    fVar211 = fVar423 * fVar337 - fVar288 * fVar320;
    fVar428 = fVar427 * fVar342 - fVar297 * fVar323;
    fVar432 = fVar431 * fVar344 - fVar300 * fVar321;
    fVar436 = fVar435 * fVar346 - fVar303 * fVar322;
    auVar360._8_4_ = fVar335;
    auVar360._12_4_ = fVar336;
    auVar174 = maxps(auVar360,auVar396);
    bVar100 = fVar211 * fVar211 <=
              auVar174._0_4_ * auVar174._0_4_ * (fVar337 * fVar337 + fVar320 * fVar320) &&
              0.0 < fVar221;
    bVar101 = fVar428 * fVar428 <=
              auVar174._4_4_ * auVar174._4_4_ * (fVar342 * fVar342 + fVar323 * fVar323) &&
              1.0 < fVar221;
    bVar95 = fVar432 * fVar432 <=
             auVar174._8_4_ * auVar174._8_4_ * (fVar344 * fVar344 + fVar321 * fVar321) &&
             2.0 < fVar221;
    bVar90 = fVar436 * fVar436 <=
             auVar174._12_4_ * auVar174._12_4_ * (fVar346 * fVar346 + fVar322 * fVar322) &&
             3.0 < fVar221;
    local_428 = (float)uVar218;
    local_428 = local_428 * 4.7683716e-07;
    auVar28._4_4_ = -(uint)bVar101;
    auVar28._0_4_ = -(uint)bVar100;
    auVar28._8_4_ = -(uint)bVar95;
    auVar28._12_4_ = -(uint)bVar90;
    iVar207 = movmskps((int)(pre->ray_space + k),auVar28);
    fVar211 = *(float *)(ray + k * 4 + 0x30);
    fStack_374 = local_378;
    fStack_370 = local_378;
    fStack_36c = local_378;
    fStack_364 = local_368;
    fStack_360 = local_368;
    fStack_35c = local_368;
    fStack_354 = local_358;
    fStack_350 = local_358;
    fStack_34c = local_358;
    if (iVar207 == 0) {
      bVar136 = 0;
    }
    else {
      local_4f8 = auVar66._0_4_;
      fStack_4f4 = auVar66._4_4_;
      fStack_4f0 = auVar66._8_4_;
      fVar147 = local_4f8 * fVar215 + fVar345 * local_368 + fVar299 * fVar390 + fVar305 * fVar410;
      fVar213 = fStack_4f4 * fVar215 + fVar347 * local_368 + fVar363 * fVar390 + fVar367 * fVar410;
      fVar217 = fStack_4f0 * fVar215 + fVar290 * local_368 + fVar302 * fVar390 + fVar425 * fVar410;
      fVar220 = fVar343 * fVar215 + fVar358 * local_368 + fVar365 * fVar390 + fVar430 * fVar410;
      local_4c8 = auVar63._0_4_;
      fStack_4c4 = auVar63._4_4_;
      fStack_4c0 = auVar63._8_4_;
      fVar289 = local_4c8 * fVar215 + fVar296 * local_368 + fVar334 * fVar390 + local_388 * fVar410;
      fVar298 = fStack_4c4 * fVar215 + fVar306 * local_368 + fVar403 * fVar390 +
                fStack_384 * fVar410;
      fVar301 = fStack_4c0 * fVar215 + fVar318 * local_368 + fVar341 * fVar390 +
                fStack_380 * fVar410;
      fVar304 = fVar332 * fVar215 + fVar319 * local_368 + fVar338 * fVar390 + fStack_37c * fVar410;
      fVar296 = *(float *)(bspline_basis0 + lVar129 + 0x1210);
      fVar306 = *(float *)(bspline_basis0 + lVar129 + 0x1214);
      fVar318 = *(float *)(bspline_basis0 + lVar129 + 0x1218);
      fVar319 = *(float *)(bspline_basis0 + lVar129 + 0x121c);
      fVar332 = *(float *)(bspline_basis0 + lVar129 + 0x1694);
      fVar334 = *(float *)(bspline_basis0 + lVar129 + 0x1698);
      fVar403 = *(float *)(bspline_basis0 + lVar129 + 0x169c);
      fVar341 = *(float *)(bspline_basis0 + lVar129 + 0x16a0);
      fVar338 = *(float *)(bspline_basis0 + lVar129 + 0x1b18);
      fVar343 = *(float *)(bspline_basis0 + lVar129 + 0x1b1c);
      fVar345 = *(float *)(bspline_basis0 + lVar129 + 0x1b20);
      fVar347 = *(float *)(bspline_basis0 + lVar129 + 0x1b24);
      fVar290 = *(float *)(bspline_basis0 + lVar129 + 0x1f9c);
      fVar358 = *(float *)(bspline_basis0 + lVar129 + 0x1fa0);
      fVar299 = *(float *)(bspline_basis0 + lVar129 + 0x1fa4);
      fVar363 = *(float *)(bspline_basis0 + lVar129 + 0x1fa8);
      fVar370 = fVar351 * fVar296 + fVar373 * fVar332 + fVar348 * fVar338 + fVar253 * fVar290;
      fVar374 = fVar351 * fVar306 + fVar373 * fVar334 + fVar348 * fVar343 + fVar253 * fVar358;
      fVar376 = fVar351 * fVar318 + fVar373 * fVar403 + fVar348 * fVar345 + fVar253 * fVar299;
      fVar378 = fVar351 * fVar319 + fVar373 * fVar341 + fVar348 * fVar347 + fVar253 * fVar363;
      fVar424 = fVar386 * fVar296 + local_378 * fVar332 + local_358 * fVar338 + fVar255 * fVar290;
      fVar429 = fVar386 * fVar306 + local_378 * fVar334 + local_358 * fVar343 + fVar255 * fVar358;
      fVar433 = fVar386 * fVar318 + local_378 * fVar403 + local_358 * fVar345 + fVar255 * fVar299;
      fVar437 = fVar386 * fVar319 + local_378 * fVar341 + local_358 * fVar347 + fVar255 * fVar363;
      fVar302 = *(float *)(bspline_basis1 + lVar129 + 0x1210);
      fVar365 = *(float *)(bspline_basis1 + lVar129 + 0x1214);
      fVar305 = *(float *)(bspline_basis1 + lVar129 + 0x1218);
      fVar367 = *(float *)(bspline_basis1 + lVar129 + 0x121c);
      fVar425 = *(float *)(bspline_basis1 + lVar129 + 0x1b18);
      fVar430 = *(float *)(bspline_basis1 + lVar129 + 0x1b1c);
      fVar428 = *(float *)(bspline_basis1 + lVar129 + 0x1b20);
      fVar432 = *(float *)(bspline_basis1 + lVar129 + 0x1b24);
      fVar436 = *(float *)(bspline_basis1 + lVar129 + 0x1f9c);
      fVar375 = *(float *)(bspline_basis1 + lVar129 + 0x1fa0);
      fVar377 = *(float *)(bspline_basis1 + lVar129 + 0x1fa4);
      fVar379 = *(float *)(bspline_basis1 + lVar129 + 0x1fa8);
      fVar380 = *(float *)(bspline_basis1 + lVar129 + 0x1694);
      fVar387 = *(float *)(bspline_basis1 + lVar129 + 0x1698);
      fVar388 = *(float *)(bspline_basis1 + lVar129 + 0x169c);
      fVar389 = *(float *)(bspline_basis1 + lVar129 + 0x16a0);
      fVar416 = fVar351 * fVar302 + fVar373 * fVar380 + fVar348 * fVar425 + fVar253 * fVar436;
      fVar420 = fVar351 * fVar365 + fVar373 * fVar387 + fVar348 * fVar430 + fVar253 * fVar375;
      fVar421 = fVar351 * fVar305 + fVar373 * fVar388 + fVar348 * fVar428 + fVar253 * fVar377;
      fVar422 = fVar351 * fVar367 + fVar373 * fVar389 + fVar348 * fVar432 + fVar253 * fVar379;
      fVar222 = fVar386 * fVar302 + local_378 * fVar380 + local_358 * fVar425 + fVar255 * fVar436;
      fVar254 = fVar386 * fVar365 + local_378 * fVar387 + local_358 * fVar430 + fVar255 * fVar375;
      fVar256 = fVar386 * fVar305 + local_378 * fVar388 + local_358 * fVar428 + fVar255 * fVar377;
      fVar257 = fVar386 * fVar367 + local_378 * fVar389 + local_358 * fVar432 + fVar255 * fVar379;
      auVar397._0_8_ = CONCAT44(fVar374,fVar370) & 0x7fffffff7fffffff;
      auVar397._8_4_ = ABS(fVar376);
      auVar397._12_4_ = ABS(fVar378);
      auVar361._0_8_ = CONCAT44(fVar429,fVar424) & 0x7fffffff7fffffff;
      auVar361._8_4_ = ABS(fVar433);
      auVar361._12_4_ = ABS(fVar437);
      auVar174 = maxps(auVar397,auVar361);
      auVar406._0_8_ =
           CONCAT44(fVar306 * fVar410 + fVar334 * fVar390 + fVar343 * local_368 + fVar358 * fVar215,
                    fVar296 * fVar410 + fVar332 * fVar390 + fVar338 * local_368 + fVar290 * fVar215)
           & 0x7fffffff7fffffff;
      auVar406._8_4_ =
           ABS(fVar318 * fVar410 + fVar403 * fVar390 + fVar345 * local_368 + fVar299 * fVar215);
      auVar406._12_4_ =
           ABS(fVar319 * fVar410 + fVar341 * fVar390 + fVar347 * local_368 + fVar363 * fVar215);
      auVar174 = maxps(auVar174,auVar406);
      uVar139 = -(uint)(local_428 <= auVar174._0_4_);
      uVar140 = -(uint)(local_428 <= auVar174._4_4_);
      uVar141 = -(uint)(local_428 <= auVar174._8_4_);
      uVar142 = -(uint)(local_428 <= auVar174._12_4_);
      fVar332 = (float)((uint)fVar370 & uVar139 | ~uVar139 & (uint)fVar337);
      fVar334 = (float)((uint)fVar374 & uVar140 | ~uVar140 & (uint)fVar342);
      fVar403 = (float)((uint)fVar376 & uVar141 | ~uVar141 & (uint)fVar344);
      fVar341 = (float)((uint)fVar378 & uVar142 | ~uVar142 & (uint)fVar346);
      auVar61._4_4_ = fVar323;
      auVar61._0_4_ = fVar320;
      auVar61._8_4_ = fVar321;
      auVar61._12_4_ = fVar322;
      fVar338 = (float)(~uVar139 & (uint)fVar320 | (uint)fVar424 & uVar139);
      fVar343 = (float)(~uVar140 & (uint)fVar323 | (uint)fVar429 & uVar140);
      fVar345 = (float)(~uVar141 & (uint)fVar321 | (uint)fVar433 & uVar141);
      fVar347 = (float)(~uVar142 & (uint)fVar322 | (uint)fVar437 & uVar142);
      auVar407._0_8_ = CONCAT44(fVar420,fVar416) & 0x7fffffff7fffffff;
      auVar407._8_4_ = ABS(fVar421);
      auVar407._12_4_ = ABS(fVar422);
      auVar369._0_8_ = CONCAT44(fVar254,fVar222) & 0x7fffffff7fffffff;
      auVar369._8_4_ = ABS(fVar256);
      auVar369._12_4_ = ABS(fVar257);
      auVar174 = maxps(auVar407,auVar369);
      auVar339._0_8_ =
           CONCAT44(fVar365 * fVar410 + fVar387 * fVar390 + fVar430 * local_368 + fVar375 * fVar215,
                    fVar302 * fVar410 + fVar380 * fVar390 + fVar425 * local_368 + fVar436 * fVar215)
           & 0x7fffffff7fffffff;
      auVar339._8_4_ =
           ABS(fVar305 * fVar410 + fVar388 * fVar390 + fVar428 * local_368 + fVar377 * fVar215);
      auVar339._12_4_ =
           ABS(fVar367 * fVar410 + fVar389 * fVar390 + fVar432 * local_368 + fVar379 * fVar215);
      auVar174 = maxps(auVar174,auVar339);
      uVar139 = -(uint)(local_428 <= auVar174._0_4_);
      uVar140 = -(uint)(local_428 <= auVar174._4_4_);
      uVar141 = -(uint)(local_428 <= auVar174._8_4_);
      uVar142 = -(uint)(local_428 <= auVar174._12_4_);
      fVar302 = (float)((uint)fVar416 & uVar139 | ~uVar139 & (uint)fVar337);
      fVar365 = (float)((uint)fVar420 & uVar140 | ~uVar140 & (uint)fVar342);
      fVar305 = (float)((uint)fVar421 & uVar141 | ~uVar141 & (uint)fVar344);
      fVar367 = (float)((uint)fVar422 & uVar142 | ~uVar142 & (uint)fVar346);
      fVar290 = (float)(~uVar139 & (uint)fVar320 | (uint)fVar222 & uVar139);
      fVar358 = (float)(~uVar140 & (uint)fVar323 | (uint)fVar254 & uVar140);
      fVar299 = (float)(~uVar141 & (uint)fVar321 | (uint)fVar256 & uVar141);
      fVar363 = (float)(~uVar142 & (uint)fVar322 | (uint)fVar257 & uVar142);
      auVar244._0_4_ = fVar338 * fVar338 + fVar332 * fVar332;
      auVar244._4_4_ = fVar343 * fVar343 + fVar334 * fVar334;
      auVar244._8_4_ = fVar345 * fVar345 + fVar403 * fVar403;
      auVar244._12_4_ = fVar347 * fVar347 + fVar341 * fVar341;
      auVar174 = rsqrtps(auVar61,auVar244);
      fVar296 = auVar174._0_4_;
      fVar306 = auVar174._4_4_;
      fVar318 = auVar174._8_4_;
      fVar319 = auVar174._12_4_;
      auVar310._0_4_ = fVar296 * fVar296 * auVar244._0_4_ * 0.5 * fVar296;
      auVar310._4_4_ = fVar306 * fVar306 * auVar244._4_4_ * 0.5 * fVar306;
      auVar310._8_4_ = fVar318 * fVar318 * auVar244._8_4_ * 0.5 * fVar318;
      auVar310._12_4_ = fVar319 * fVar319 * auVar244._12_4_ * 0.5 * fVar319;
      fVar425 = fVar296 * 1.5 - auVar310._0_4_;
      fVar430 = fVar306 * 1.5 - auVar310._4_4_;
      fVar337 = fVar318 * 1.5 - auVar310._8_4_;
      fVar342 = fVar319 * 1.5 - auVar310._12_4_;
      auVar245._0_4_ = fVar290 * fVar290 + fVar302 * fVar302;
      auVar245._4_4_ = fVar358 * fVar358 + fVar365 * fVar365;
      auVar245._8_4_ = fVar299 * fVar299 + fVar305 * fVar305;
      auVar245._12_4_ = fVar363 * fVar363 + fVar367 * fVar367;
      auVar174 = rsqrtps(auVar310,auVar245);
      fVar296 = auVar174._0_4_;
      fVar306 = auVar174._4_4_;
      fVar318 = auVar174._8_4_;
      fVar319 = auVar174._12_4_;
      fVar296 = fVar296 * 1.5 - fVar296 * fVar296 * auVar245._0_4_ * 0.5 * fVar296;
      fVar306 = fVar306 * 1.5 - fVar306 * fVar306 * auVar245._4_4_ * 0.5 * fVar306;
      fVar318 = fVar318 * 1.5 - fVar318 * fVar318 * auVar245._8_4_ * 0.5 * fVar318;
      fVar319 = fVar319 * 1.5 - fVar319 * fVar319 * auVar245._12_4_ * 0.5 * fVar319;
      fVar222 = fVar338 * fVar425 * fVar324;
      fVar256 = fVar343 * fVar430 * fVar333;
      fVar370 = fVar345 * fVar337 * fVar335;
      fVar376 = fVar347 * fVar342 * fVar336;
      fVar338 = -fVar332 * fVar425 * fVar324;
      fVar343 = -fVar334 * fVar430 * fVar333;
      fVar345 = -fVar403 * fVar337 * fVar335;
      fVar347 = -fVar341 * fVar342 * fVar336;
      fVar424 = fVar425 * 0.0 * fVar324;
      fVar429 = fVar430 * 0.0 * fVar333;
      fVar433 = fVar337 * 0.0 * fVar335;
      fVar437 = fVar342 * 0.0 * fVar336;
      fVar416 = fVar290 * fVar296 * auVar396._0_4_;
      fVar420 = fVar358 * fVar306 * auVar396._4_4_;
      fVar421 = fVar299 * fVar318 * auVar396._8_4_;
      fVar422 = fVar363 * fVar319 * auVar396._12_4_;
      fVar436 = fVar349 + fVar416;
      fVar375 = fVar352 + fVar420;
      fVar377 = fVar354 + fVar421;
      fVar379 = fVar356 + fVar422;
      fVar425 = -fVar302 * fVar296 * auVar396._0_4_;
      fVar430 = -fVar365 * fVar306 * auVar396._4_4_;
      fVar428 = -fVar305 * fVar318 * auVar396._8_4_;
      fVar432 = -fVar367 * fVar319 * auVar396._12_4_;
      fVar380 = fVar146 + fVar425;
      fVar387 = fVar212 + fVar430;
      fVar388 = fVar216 + fVar428;
      fVar389 = fVar219 + fVar432;
      fVar358 = fVar296 * 0.0 * auVar396._0_4_;
      fVar363 = fVar306 * 0.0 * auVar396._4_4_;
      fVar365 = fVar318 * 0.0 * auVar396._8_4_;
      fVar367 = fVar319 * 0.0 * auVar396._12_4_;
      fVar337 = fVar288 - fVar222;
      fVar342 = fVar297 - fVar256;
      fVar344 = fVar300 - fVar370;
      fVar346 = fVar303 - fVar376;
      fVar254 = fVar147 + fVar358;
      fVar257 = fVar213 + fVar363;
      fVar374 = fVar217 + fVar365;
      fVar378 = fVar220 + fVar367;
      fVar332 = fVar423 - fVar338;
      fVar334 = fVar427 - fVar343;
      fVar403 = fVar431 - fVar345;
      fVar341 = fVar435 - fVar347;
      fVar290 = fVar289 - fVar424;
      fVar299 = fVar298 - fVar429;
      fVar302 = fVar301 - fVar433;
      fVar305 = fVar304 - fVar437;
      uVar139 = -(uint)(0.0 < (fVar332 * (fVar254 - fVar290) - fVar290 * (fVar380 - fVar332)) * 0.0
                              + (fVar290 * (fVar436 - fVar337) - (fVar254 - fVar290) * fVar337) *
                                0.0 + ((fVar380 - fVar332) * fVar337 - (fVar436 - fVar337) * fVar332
                                      ));
      uVar140 = -(uint)(0.0 < (fVar334 * (fVar257 - fVar299) - fVar299 * (fVar387 - fVar334)) * 0.0
                              + (fVar299 * (fVar375 - fVar342) - (fVar257 - fVar299) * fVar342) *
                                0.0 + ((fVar387 - fVar334) * fVar342 - (fVar375 - fVar342) * fVar334
                                      ));
      uVar141 = -(uint)(0.0 < (fVar403 * (fVar374 - fVar302) - fVar302 * (fVar388 - fVar403)) * 0.0
                              + (fVar302 * (fVar377 - fVar344) - (fVar374 - fVar302) * fVar344) *
                                0.0 + ((fVar388 - fVar403) * fVar344 - (fVar377 - fVar344) * fVar403
                                      ));
      uVar142 = -(uint)(0.0 < (fVar341 * (fVar378 - fVar305) - fVar305 * (fVar389 - fVar341)) * 0.0
                              + (fVar305 * (fVar379 - fVar346) - (fVar378 - fVar305) * fVar346) *
                                0.0 + ((fVar389 - fVar341) * fVar346 - (fVar379 - fVar346) * fVar341
                                      ));
      fVar296 = (float)((uint)(fVar349 - fVar416) & uVar139 | ~uVar139 & (uint)(fVar288 + fVar222));
      fVar306 = (float)((uint)(fVar352 - fVar420) & uVar140 | ~uVar140 & (uint)(fVar297 + fVar256));
      fVar318 = (float)((uint)(fVar354 - fVar421) & uVar141 | ~uVar141 & (uint)(fVar300 + fVar370));
      fVar319 = (float)((uint)(fVar356 - fVar422) & uVar142 | ~uVar142 & (uint)(fVar303 + fVar376));
      fVar425 = (float)((uint)(fVar146 - fVar425) & uVar139 | ~uVar139 & (uint)(fVar423 + fVar338));
      fVar430 = (float)((uint)(fVar212 - fVar430) & uVar140 | ~uVar140 & (uint)(fVar427 + fVar343));
      fVar146 = (float)((uint)(fVar216 - fVar428) & uVar141 | ~uVar141 & (uint)(fVar431 + fVar345));
      fVar212 = (float)((uint)(fVar219 - fVar432) & uVar142 | ~uVar142 & (uint)(fVar435 + fVar347));
      fVar147 = (float)((uint)(fVar147 - fVar358) & uVar139 | ~uVar139 & (uint)(fVar289 + fVar424));
      fVar213 = (float)((uint)(fVar213 - fVar363) & uVar140 | ~uVar140 & (uint)(fVar298 + fVar429));
      fVar217 = (float)((uint)(fVar217 - fVar365) & uVar141 | ~uVar141 & (uint)(fVar301 + fVar433));
      fVar220 = (float)((uint)(fVar220 - fVar367) & uVar142 | ~uVar142 & (uint)(fVar304 + fVar437));
      fVar216 = (float)((uint)fVar337 & uVar139 | ~uVar139 & (uint)fVar436);
      fVar219 = (float)((uint)fVar342 & uVar140 | ~uVar140 & (uint)fVar375);
      fVar288 = (float)((uint)fVar344 & uVar141 | ~uVar141 & (uint)fVar377);
      fVar297 = (float)((uint)fVar346 & uVar142 | ~uVar142 & (uint)fVar379);
      fVar338 = (float)((uint)fVar332 & uVar139 | ~uVar139 & (uint)fVar380);
      fVar343 = (float)((uint)fVar334 & uVar140 | ~uVar140 & (uint)fVar387);
      fVar345 = (float)((uint)fVar403 & uVar141 | ~uVar141 & (uint)fVar388);
      fVar347 = (float)((uint)fVar341 & uVar142 | ~uVar142 & (uint)fVar389);
      fVar358 = (float)((uint)fVar290 & uVar139 | ~uVar139 & (uint)fVar254);
      fVar363 = (float)((uint)fVar299 & uVar140 | ~uVar140 & (uint)fVar257);
      fVar365 = (float)((uint)fVar302 & uVar141 | ~uVar141 & (uint)fVar374);
      fVar367 = (float)((uint)fVar305 & uVar142 | ~uVar142 & (uint)fVar378);
      fVar300 = (float)((uint)fVar436 & uVar139 | ~uVar139 & (uint)fVar337) - fVar296;
      fVar303 = (float)((uint)fVar375 & uVar140 | ~uVar140 & (uint)fVar342) - fVar306;
      fVar337 = (float)((uint)fVar377 & uVar141 | ~uVar141 & (uint)fVar344) - fVar318;
      fVar342 = (float)((uint)fVar379 & uVar142 | ~uVar142 & (uint)fVar346) - fVar319;
      fVar344 = (float)((uint)fVar380 & uVar139 | ~uVar139 & (uint)fVar332) - fVar425;
      fVar346 = (float)((uint)fVar387 & uVar140 | ~uVar140 & (uint)fVar334) - fVar430;
      fVar349 = (float)((uint)fVar388 & uVar141 | ~uVar141 & (uint)fVar403) - fVar146;
      fVar352 = (float)((uint)fVar389 & uVar142 | ~uVar142 & (uint)fVar341) - fVar212;
      fVar354 = (float)((uint)fVar254 & uVar139 | ~uVar139 & (uint)fVar290) - fVar147;
      fVar356 = (float)((uint)fVar257 & uVar140 | ~uVar140 & (uint)fVar299) - fVar213;
      fVar423 = (float)((uint)fVar374 & uVar141 | ~uVar141 & (uint)fVar302) - fVar217;
      fVar427 = (float)((uint)fVar378 & uVar142 | ~uVar142 & (uint)fVar305) - fVar220;
      fVar436 = fVar296 - fVar216;
      fVar375 = fVar306 - fVar219;
      fVar377 = fVar318 - fVar288;
      fVar379 = fVar319 - fVar297;
      fVar290 = fVar425 - fVar338;
      fVar299 = fVar430 - fVar343;
      fVar302 = fVar146 - fVar345;
      fVar305 = fVar212 - fVar347;
      fVar332 = fVar147 - fVar358;
      fVar334 = fVar213 - fVar363;
      fVar403 = fVar217 - fVar365;
      fVar341 = fVar220 - fVar367;
      fVar428 = (fVar425 * fVar354 - fVar147 * fVar344) * 0.0 +
                (fVar147 * fVar300 - fVar296 * fVar354) * 0.0 +
                (fVar296 * fVar344 - fVar425 * fVar300);
      fVar431 = (fVar430 * fVar356 - fVar213 * fVar346) * 0.0 +
                (fVar213 * fVar303 - fVar306 * fVar356) * 0.0 +
                (fVar306 * fVar346 - fVar430 * fVar303);
      auVar292._4_4_ = fVar431;
      auVar292._0_4_ = fVar428;
      fVar432 = (fVar146 * fVar423 - fVar217 * fVar349) * 0.0 +
                (fVar217 * fVar337 - fVar318 * fVar423) * 0.0 +
                (fVar318 * fVar349 - fVar146 * fVar337);
      fVar435 = (fVar212 * fVar427 - fVar220 * fVar352) * 0.0 +
                (fVar220 * fVar342 - fVar319 * fVar427) * 0.0 +
                (fVar319 * fVar352 - fVar212 * fVar342);
      auVar417._0_4_ =
           (fVar338 * fVar332 - fVar358 * fVar290) * 0.0 +
           (fVar358 * fVar436 - fVar216 * fVar332) * 0.0 + (fVar216 * fVar290 - fVar338 * fVar436);
      auVar417._4_4_ =
           (fVar343 * fVar334 - fVar363 * fVar299) * 0.0 +
           (fVar363 * fVar375 - fVar219 * fVar334) * 0.0 + (fVar219 * fVar299 - fVar343 * fVar375);
      auVar417._8_4_ =
           (fVar345 * fVar403 - fVar365 * fVar302) * 0.0 +
           (fVar365 * fVar377 - fVar288 * fVar403) * 0.0 + (fVar288 * fVar302 - fVar345 * fVar377);
      auVar417._12_4_ =
           (fVar347 * fVar341 - fVar367 * fVar305) * 0.0 +
           (fVar367 * fVar379 - fVar297 * fVar341) * 0.0 + (fVar297 * fVar305 - fVar347 * fVar379);
      auVar292._8_4_ = fVar432;
      auVar292._12_4_ = fVar435;
      auVar174 = maxps(auVar292,auVar417);
      bVar100 = auVar174._0_4_ <= 0.0 && bVar100;
      auVar293._0_4_ = -(uint)bVar100;
      bVar101 = auVar174._4_4_ <= 0.0 && bVar101;
      auVar293._4_4_ = -(uint)bVar101;
      bVar95 = auVar174._8_4_ <= 0.0 && bVar95;
      auVar293._8_4_ = -(uint)bVar95;
      bVar90 = auVar174._12_4_ <= 0.0 && bVar90;
      auVar293._12_4_ = -(uint)bVar90;
      iVar207 = movmskps(iVar207,auVar293);
      if (iVar207 == 0) {
LAB_0038ae55:
        iVar207 = 0;
        auVar199._8_8_ = uStack_390;
        auVar199._0_8_ = local_398;
      }
      else {
        auVar311._0_4_ = fVar332 * fVar344;
        auVar311._4_4_ = fVar334 * fVar346;
        auVar311._8_4_ = fVar403 * fVar349;
        auVar311._12_4_ = fVar341 * fVar352;
        fVar358 = fVar290 * fVar354 - auVar311._0_4_;
        fVar363 = fVar299 * fVar356 - auVar311._4_4_;
        fVar365 = fVar302 * fVar423 - auVar311._8_4_;
        fVar367 = fVar305 * fVar427 - auVar311._12_4_;
        fVar332 = fVar332 * fVar300 - fVar354 * fVar436;
        fVar338 = fVar334 * fVar303 - fVar356 * fVar375;
        fVar343 = fVar403 * fVar337 - fVar423 * fVar377;
        fVar345 = fVar341 * fVar342 - fVar427 * fVar379;
        fVar290 = fVar436 * fVar344 - fVar290 * fVar300;
        fVar299 = fVar375 * fVar346 - fVar299 * fVar303;
        fVar302 = fVar377 * fVar349 - fVar302 * fVar337;
        fVar305 = fVar379 * fVar352 - fVar305 * fVar342;
        auVar327._0_4_ = fVar358 * 0.0 + fVar332 * 0.0 + fVar290;
        auVar327._4_4_ = fVar363 * 0.0 + fVar338 * 0.0 + fVar299;
        auVar327._8_4_ = fVar365 * 0.0 + fVar343 * 0.0 + fVar302;
        auVar327._12_4_ = fVar367 * 0.0 + fVar345 * 0.0 + fVar305;
        auVar174 = rcpps(auVar311,auVar327);
        fVar334 = auVar174._0_4_;
        fVar403 = auVar174._4_4_;
        fVar341 = auVar174._8_4_;
        fVar347 = auVar174._12_4_;
        fVar334 = (1.0 - auVar327._0_4_ * fVar334) * fVar334 + fVar334;
        fVar403 = (1.0 - auVar327._4_4_ * fVar403) * fVar403 + fVar403;
        fVar341 = (1.0 - auVar327._8_4_ * fVar341) * fVar341 + fVar341;
        fVar347 = (1.0 - auVar327._12_4_ * fVar347) * fVar347 + fVar347;
        fVar332 = (fVar147 * fVar290 + fVar425 * fVar332 + fVar296 * fVar358) * fVar334;
        fVar306 = (fVar213 * fVar299 + fVar430 * fVar338 + fVar306 * fVar363) * fVar403;
        aVar398.v[1] = fVar306;
        aVar398.v[0] = fVar332;
        fVar318 = (fVar217 * fVar302 + fVar146 * fVar343 + fVar318 * fVar365) * fVar341;
        fVar319 = (fVar220 * fVar305 + fVar212 * fVar345 + fVar319 * fVar367) * fVar347;
        fVar296 = *(float *)(ray + k * 4 + 0x80);
        bVar100 = (fVar332 <= fVar296 && fVar211 <= fVar332) && bVar100;
        auVar312._0_4_ = -(uint)bVar100;
        bVar101 = (fVar306 <= fVar296 && fVar211 <= fVar306) && bVar101;
        auVar312._4_4_ = -(uint)bVar101;
        bVar95 = (fVar318 <= fVar296 && fVar211 <= fVar318) && bVar95;
        auVar312._8_4_ = -(uint)bVar95;
        bVar90 = (fVar319 <= fVar296 && fVar211 <= fVar319) && bVar90;
        auVar312._12_4_ = -(uint)bVar90;
        iVar207 = movmskps(iVar207,auVar312);
        if (iVar207 == 0) goto LAB_0038ae55;
        auVar313._0_8_ =
             CONCAT44(-(uint)(auVar327._4_4_ != 0.0 && bVar101),
                      -(uint)(auVar327._0_4_ != 0.0 && bVar100));
        auVar313._8_4_ = -(uint)(auVar327._8_4_ != 0.0 && bVar95);
        auVar313._12_4_ = -(uint)(auVar327._12_4_ != 0.0 && bVar90);
        iVar207 = movmskps(iVar207,auVar313);
        auVar199._8_8_ = uStack_390;
        auVar199._0_8_ = local_398;
        if (iVar207 != 0) {
          fVar428 = fVar428 * fVar334;
          fVar431 = fVar431 * fVar403;
          fVar432 = fVar432 * fVar341;
          fVar435 = fVar435 * fVar347;
          auVar198._0_4_ = ~uVar139 & (uint)fVar428;
          auVar198._4_4_ = ~uVar140 & (uint)fVar431;
          auVar198._8_4_ = ~uVar141 & (uint)fVar432;
          auVar198._12_4_ = ~uVar142 & (uint)fVar435;
          auVar371._0_4_ = (uint)(1.0 - fVar428) & uVar139;
          auVar371._4_4_ = (uint)(1.0 - fVar431) & uVar140;
          auVar371._8_4_ = (uint)(1.0 - fVar432) & uVar141;
          auVar371._12_4_ = (uint)(1.0 - fVar435) & uVar142;
          aVar372 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)(auVar371 | auVar198);
          local_278 = (float)(~uVar139 & (uint)(auVar417._0_4_ * fVar334) |
                             (uint)(1.0 - auVar417._0_4_ * fVar334) & uVar139);
          fStack_274 = (float)(~uVar140 & (uint)(auVar417._4_4_ * fVar403) |
                              (uint)(1.0 - auVar417._4_4_ * fVar403) & uVar140);
          fStack_270 = (float)(~uVar141 & (uint)(auVar417._8_4_ * fVar341) |
                              (uint)(1.0 - auVar417._8_4_ * fVar341) & uVar141);
          fStack_26c = (float)(~uVar142 & (uint)(auVar417._12_4_ * fVar347) |
                              (uint)(1.0 - auVar417._12_4_ * fVar347) & uVar142);
          auVar199._8_4_ = auVar313._8_4_;
          auVar199._0_8_ = auVar313._0_8_;
          auVar199._12_4_ = auVar313._12_4_;
          aVar398.v[2] = fVar318;
          aVar398.v[3] = fVar319;
          aVar392 = aVar398;
        }
      }
      iVar207 = movmskps(iVar207,auVar199);
      local_388 = fVar320;
      fStack_384 = fVar323;
      fStack_380 = fVar321;
      fStack_37c = fVar322;
      if (iVar207 == 0) {
        bVar136 = 0;
      }
      else {
        fVar324 = (auVar396._0_4_ - fVar324) * aVar372.v[0] + fVar324;
        fVar333 = (auVar396._4_4_ - fVar333) * aVar372.v[1] + fVar333;
        fVar335 = (auVar396._8_4_ - fVar335) * aVar372.v[2] + fVar335;
        fVar336 = (auVar396._12_4_ - fVar336) * aVar372.v[3] + fVar336;
        fVar296 = *(float *)((long)local_3b0->ray_space + k * 4 + -0x10);
        aVar246._0_4_ = -(uint)(fVar296 * (fVar324 + fVar324) < aVar392.v[0]) & auVar199._0_4_;
        aVar246._4_4_ = -(uint)(fVar296 * (fVar333 + fVar333) < aVar392.v[1]) & auVar199._4_4_;
        aVar246._8_4_ = -(uint)(fVar296 * (fVar335 + fVar335) < aVar392.v[2]) & auVar199._8_4_;
        aVar246._12_4_ = -(uint)(fVar296 * (fVar336 + fVar336) < aVar392.v[3]) & auVar199._12_4_;
        uVar139 = movmskps((int)local_3b0,(undefined1  [16])aVar246);
        if (uVar139 != 0) {
          local_278 = local_278 + local_278 + -1.0;
          fStack_274 = fStack_274 + fStack_274 + -1.0;
          fStack_270 = fStack_270 + fStack_270 + -1.0;
          fStack_26c = fStack_26c + fStack_26c + -1.0;
          bhit.i = 0;
          bhit.curve3D.v0.field_0._0_8_ = CONCAT44(fVar426,fVar400);
          bhit.curve3D.v0.field_0._8_8_ = CONCAT44(fVar355,fVar353);
          bhit.curve3D.v1.field_0._0_8_ = CONCAT44(fVar414,fVar413);
          bhit.curve3D.v1.field_0._8_8_ = CONCAT44(fVar434,fVar415);
          bhit.curve3D.v2.field_0._0_8_ = CONCAT44(fVar362,fVar357);
          bhit.curve3D.v2.field_0._8_8_ = CONCAT44(fVar366,fVar364);
          bhit.curve3D.v3.field_0._0_8_ = CONCAT44(fVar402,fVar401);
          bhit.curve3D.v3.field_0._8_8_ = CONCAT44(fVar411,fVar404);
          pRVar130 = (RTCIntersectArguments *)(ulong)*(uint *)(ray + k * 4 + 0x90);
          bhit.U.field_0 = aVar372;
          bhit.V.field_0.v[0] = local_278;
          bhit.V.field_0.v[1] = fStack_274;
          bhit.V.field_0.v[2] = fStack_270;
          bhit.V.field_0.v[3] = fStack_26c;
          bhit.T.field_0 = aVar392;
          bhit.N = iVar286;
          bhit.valid.field_0 = aVar246;
          if ((pGVar26->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
            pRVar130 = local_3a0->args;
            if ((pRVar130->filter != (RTCFilterFunctionN)0x0) ||
               (bVar136 = 1, pGVar26->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              fVar296 = 1.0 / fVar221;
              bhit.vu.field_0.v[0] = fVar296 * (aVar372.v[0] + 0.0);
              bhit.vu.field_0.v[1] = fVar296 * (aVar372.v[1] + 1.0);
              bhit.vu.field_0.v[2] = fVar296 * (aVar372.v[2] + 2.0);
              bhit.vu.field_0.v[3] = fVar296 * (aVar372.v[3] + 3.0);
              bhit.vv.field_0._0_8_ = CONCAT44(fStack_274,local_278);
              bhit.vv.field_0._8_8_ = CONCAT44(fStack_26c,fStack_270);
              bhit.vt.field_0 = aVar392;
              uVar131 = (ulong)(uVar139 & 0xff);
              uVar135 = 0;
              if (uVar131 != 0) {
                for (; ((uVar139 & 0xff) >> uVar135 & 1) == 0; uVar135 = uVar135 + 1) {
                }
              }
              local_3e8 = CONCAT44((undefined4)local_3a8,(undefined4)local_3a8);
              uStack_3e0._0_4_ = (undefined4)local_3a8;
              uStack_3e0._4_4_ = (undefined4)local_3a8;
              local_3f8 = CONCAT44(uVar138,uVar138);
              auVar63 = *(undefined1 (*) [12])*local_340;
              uStack_3fc = (undefined4)((ulong)*(undefined8 *)(*local_340 + 8) >> 0x20);
              while (uVar131 != 0) {
                local_f8 = bhit.vu.field_0.v[uVar135];
                uVar133 = *(undefined4 *)(ray + k * 4 + 0x80);
                local_e8 = bhit.vv.field_0.v[uVar135];
                *(float *)(ray + k * 4 + 0x80) = bhit.vt.field_0.v[uVar135];
                fVar319 = 1.0 - local_f8;
                fVar296 = local_f8 * fVar319 * 4.0;
                fVar320 = (fVar319 * fVar319 + fVar296) * 0.5;
                fVar306 = local_f8 * local_f8 * 0.5;
                fVar318 = (-local_f8 * local_f8 - fVar296) * 0.5;
                args.context = context->user;
                fVar296 = -fVar319 * fVar319 * 0.5;
                local_128 = fVar296 * fVar400 +
                            fVar318 * fVar413 + fVar320 * fVar357 + fVar306 * fVar401;
                local_118 = fVar296 * fVar426 +
                            fVar318 * fVar414 + fVar320 * fVar362 + fVar306 * fVar402;
                local_108 = fVar296 * fVar353 +
                            fVar318 * fVar415 + fVar320 * fVar364 + fVar306 * fVar404;
                fStack_124 = local_128;
                fStack_120 = local_128;
                fStack_11c = local_128;
                fStack_114 = local_118;
                fStack_110 = local_118;
                fStack_10c = local_118;
                fStack_104 = local_108;
                fStack_100 = local_108;
                fStack_fc = local_108;
                fStack_f4 = local_f8;
                fStack_f0 = local_f8;
                fStack_ec = local_f8;
                fStack_e4 = local_e8;
                fStack_e0 = local_e8;
                fStack_dc = local_e8;
                local_d8 = local_3f8;
                uStack_d0 = CONCAT44(uVar138,uVar138);
                local_c8 = local_3e8;
                uStack_c0 = uStack_3e0;
                local_b8 = (args.context)->instID[0];
                uStack_b4 = local_b8;
                uStack_b0 = local_b8;
                uStack_ac = local_b8;
                local_a8 = (args.context)->instPrimID[0];
                uStack_a4 = local_a8;
                uStack_a0 = local_a8;
                uStack_9c = local_a8;
                local_3c8._12_4_ = uStack_3fc;
                local_3c8._0_12_ = auVar63;
                args.valid = (int *)local_3c8;
                pRVar130 = (RTCIntersectArguments *)pGVar26->userPtr;
                args.hit = (RTCHitN *)&local_128;
                args.N = 4;
                p_Var127 = pGVar26->occlusionFilterN;
                args.geometryUserPtr = pRVar130;
                args.ray = (RTCRayN *)ray;
                if (p_Var127 != (RTCFilterFunctionN)0x0) {
                  p_Var127 = (RTCFilterFunctionN)(*p_Var127)(&args);
                }
                auVar247._0_4_ = -(uint)(local_3c8._0_4_ == 0);
                auVar247._4_4_ = -(uint)(local_3c8._4_4_ == 0);
                auVar247._8_4_ = -(uint)(local_3c8._8_4_ == 0);
                auVar247._12_4_ = -(uint)(local_3c8._12_4_ == 0);
                uVar139 = movmskps((int)p_Var127,auVar247);
                pRVar128 = (RTCRayN *)(ulong)(uVar139 ^ 0xf);
                if ((uVar139 ^ 0xf) == 0) {
                  auVar247 = auVar247 ^ _DAT_01f46b70;
                }
                else {
                  pRVar130 = context->args;
                  if ((pRVar130->filter != (RTCFilterFunctionN)0x0) &&
                     (((pRVar130->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar26->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*pRVar130->filter)(&args);
                  }
                  auVar200._0_4_ = -(uint)(local_3c8._0_4_ == 0);
                  auVar200._4_4_ = -(uint)(local_3c8._4_4_ == 0);
                  auVar200._8_4_ = -(uint)(local_3c8._8_4_ == 0);
                  auVar200._12_4_ = -(uint)(local_3c8._12_4_ == 0);
                  auVar247 = auVar200 ^ _DAT_01f46b70;
                  *(undefined1 (*) [16])(args.ray + 0x80) =
                       ~auVar200 & _DAT_01f45a40 |
                       *(undefined1 (*) [16])(args.ray + 0x80) & auVar200;
                  pRVar128 = args.ray;
                }
                auVar248._0_4_ = auVar247._0_4_ << 0x1f;
                auVar248._4_4_ = auVar247._4_4_ << 0x1f;
                auVar248._8_4_ = auVar247._8_4_ << 0x1f;
                auVar248._12_4_ = auVar247._12_4_ << 0x1f;
                iVar207 = movmskps((int)pRVar128,auVar248);
                if (iVar207 != 0) {
                  bVar136 = 1;
                  goto LAB_00389ed2;
                }
                *(undefined4 *)(ray + k * 4 + 0x80) = uVar133;
                uVar131 = uVar131 ^ 1L << (uVar135 & 0x3f);
                uVar135 = 0;
                if (uVar131 != 0) {
                  for (; (uVar131 >> uVar135 & 1) == 0; uVar135 = uVar135 + 1) {
                  }
                }
              }
              bVar136 = 0;
            }
            goto LAB_00389ed2;
          }
        }
        bVar136 = 0;
      }
    }
LAB_00389ed2:
    uVar133 = SUB84(pRVar130,0);
    if (4 < iVar286) {
      local_68 = iVar286;
      iStack_64 = iVar286;
      iStack_60 = iVar286;
      iStack_5c = iVar286;
      local_98 = 1.0 / fVar221;
      fStack_94 = local_98;
      fStack_90 = local_98;
      fStack_8c = local_98;
      local_78 = (undefined4)local_3a8;
      uStack_74 = (undefined4)local_3a8;
      uStack_70 = (undefined4)local_3a8;
      uStack_6c = (undefined4)local_3a8;
      local_88 = uVar138;
      uStack_84 = uVar138;
      uStack_80 = uVar138;
      uStack_7c = uVar138;
      for (lVar132 = 4; uVar133 = SUB84(pRVar130,0), lVar132 < iVar286; lVar132 = lVar132 + 4) {
        uVar139 = (uint)lVar132;
        pRVar130 = (RTCIntersectArguments *)(bspline_basis0 + lVar129);
        pRVar7 = &pRVar130->flags + lVar132;
        fVar221 = (float)*pRVar7;
        fVar296 = (float)pRVar7[1];
        fVar306 = (float)pRVar7[2];
        fVar318 = (float)pRVar7[3];
        pfVar1 = (float *)(lVar129 + 0x21fffac + lVar132 * 4);
        local_388 = *pfVar1;
        fStack_384 = pfVar1[1];
        fStack_380 = pfVar1[2];
        fStack_37c = pfVar1[3];
        pauVar9 = (undefined1 (*) [12])(lVar129 + 0x2200430 + lVar132 * 4);
        fVar319 = *(float *)*pauVar9;
        fVar320 = *(float *)(*pauVar9 + 4);
        fVar323 = *(float *)(*pauVar9 + 8);
        auVar63 = *pauVar9;
        fVar332 = *(float *)pauVar9[1];
        pfVar1 = (float *)(lVar129 + 0x22008b4 + lVar132 * 4);
        fVar334 = *pfVar1;
        fVar403 = pfVar1[1];
        fVar341 = pfVar1[2];
        fVar338 = pfVar1[3];
        fVar322 = fVar351 * fVar221 + fVar373 * local_388 + fVar348 * fVar319 + fVar253 * fVar334;
        fVar337 = fVar351 * fVar296 + fVar373 * fStack_384 + fVar348 * fVar320 + fVar253 * fVar403;
        fVar342 = fVar351 * fVar306 + fVar373 * fStack_380 + fVar348 * fVar323 + fVar253 * fVar341;
        fVar344 = fVar351 * fVar318 + fVar373 * fStack_37c + fVar348 * fVar332 + fVar253 * fVar338;
        fVar346 = fVar386 * fVar221 +
                  local_378 * local_388 + local_358 * fVar319 + fVar255 * fVar334;
        fVar352 = fVar386 * fVar296 +
                  fStack_374 * fStack_384 + fStack_354 * fVar320 + fVar255 * fVar403;
        fVar356 = fVar386 * fVar306 +
                  fStack_370 * fStack_380 + fStack_350 * fVar323 + fVar255 * fVar341;
        fVar427 = fVar386 * fVar318 +
                  fStack_36c * fStack_37c + fStack_34c * fVar332 + fVar255 * fVar338;
        auVar250._0_4_ =
             fVar355 * fVar221 + fVar434 * local_388 + fVar366 * fVar319 + fVar411 * fVar334;
        auVar250._4_4_ =
             fVar355 * fVar296 + fVar434 * fStack_384 + fVar366 * fVar320 + fVar411 * fVar403;
        auVar250._8_4_ =
             fVar355 * fVar306 + fVar434 * fStack_380 + fVar366 * fVar323 + fVar411 * fVar341;
        auVar250._12_4_ =
             fVar355 * fVar318 + fVar434 * fStack_37c + fVar366 * fVar332 + fVar411 * fVar338;
        pfVar1 = (float *)(bspline_basis1 + lVar129 + lVar132 * 4);
        fVar319 = *pfVar1;
        fVar320 = pfVar1[1];
        fVar323 = pfVar1[2];
        fVar343 = pfVar1[3];
        pfVar1 = (float *)(lVar129 + 0x22023cc + lVar132 * 4);
        fVar345 = *pfVar1;
        fVar347 = pfVar1[1];
        fVar290 = pfVar1[2];
        fVar358 = pfVar1[3];
        pfVar1 = (float *)(lVar129 + 0x2202850 + lVar132 * 4);
        fVar299 = *pfVar1;
        fVar363 = pfVar1[1];
        fVar302 = pfVar1[2];
        fVar365 = pfVar1[3];
        pauVar9 = (undefined1 (*) [12])(lVar129 + 0x2202cd4 + lVar132 * 4);
        fVar305 = *(float *)*pauVar9;
        fVar367 = *(float *)(*pauVar9 + 4);
        fVar425 = *(float *)(*pauVar9 + 8);
        auVar66 = *pauVar9;
        fVar430 = *(float *)pauVar9[1];
        fVar212 = fVar351 * fVar319 + fVar373 * fVar345 + fVar348 * fVar299 + fVar253 * fVar305;
        fVar219 = fVar351 * fVar320 + fVar373 * fVar347 + fVar348 * fVar363 + fVar253 * fVar367;
        fVar324 = fVar351 * fVar323 + fVar373 * fVar290 + fVar348 * fVar302 + fVar253 * fVar425;
        fVar333 = fVar351 * fVar343 + fVar373 * fVar358 + fVar348 * fVar365 + fVar253 * fVar430;
        fVar335 = fVar386 * fVar319 + local_378 * fVar345 + local_358 * fVar299 + fVar255 * fVar305;
        fVar303 = fVar386 * fVar320 +
                  fStack_374 * fVar347 + fStack_354 * fVar363 + fVar255 * fVar367;
        fVar336 = fVar386 * fVar323 +
                  fStack_370 * fVar290 + fStack_350 * fVar302 + fVar255 * fVar425;
        fVar321 = fVar386 * fVar343 +
                  fStack_36c * fVar358 + fStack_34c * fVar365 + fVar255 * fVar430;
        auVar418._0_4_ =
             fVar355 * fVar319 + fVar434 * fVar345 + fVar366 * fVar299 + fVar411 * fVar305;
        auVar418._4_4_ =
             fVar355 * fVar320 + fVar434 * fVar347 + fVar366 * fVar363 + fVar411 * fVar367;
        auVar418._8_4_ =
             fVar355 * fVar323 + fVar434 * fVar290 + fVar366 * fVar302 + fVar411 * fVar425;
        auVar418._12_4_ =
             fVar355 * fVar343 + fVar434 * fVar358 + fVar366 * fVar365 + fVar411 * fVar430;
        fVar216 = fVar212 - fVar322;
        fVar288 = fVar219 - fVar337;
        fVar297 = fVar324 - fVar342;
        fVar300 = fVar333 - fVar344;
        fVar305 = fVar335 - fVar346;
        fVar367 = fVar303 - fVar352;
        fVar425 = fVar336 - fVar356;
        fVar146 = fVar321 - fVar427;
        fVar349 = fVar346 * fVar216 - fVar322 * fVar305;
        fVar354 = fVar352 * fVar288 - fVar337 * fVar367;
        fVar423 = fVar356 * fVar297 - fVar342 * fVar425;
        fVar428 = fVar427 * fVar300 - fVar344 * fVar146;
        auVar174 = maxps(auVar250,auVar418);
        bVar100 = fVar349 * fVar349 <=
                  auVar174._0_4_ * auVar174._0_4_ * (fVar216 * fVar216 + fVar305 * fVar305) &&
                  (int)uVar139 < local_68;
        auVar350._0_4_ = -(uint)bVar100;
        bVar101 = fVar354 * fVar354 <=
                  auVar174._4_4_ * auVar174._4_4_ * (fVar288 * fVar288 + fVar367 * fVar367) &&
                  (int)(uVar139 | 1) < iStack_64;
        auVar350._4_4_ = -(uint)bVar101;
        bVar95 = fVar423 * fVar423 <=
                 auVar174._8_4_ * auVar174._8_4_ * (fVar297 * fVar297 + fVar425 * fVar425) &&
                 (int)(uVar139 | 2) < iStack_60;
        auVar350._8_4_ = -(uint)bVar95;
        bVar90 = fVar428 * fVar428 <=
                 auVar174._12_4_ * auVar174._12_4_ * (fVar300 * fVar300 + fVar146 * fVar146) &&
                 (int)(uVar139 | 3) < iStack_5c;
        auVar350._12_4_ = -(uint)bVar90;
        uVar138 = movmskps((int)uVar131,auVar350);
        uVar131 = (ulong)uVar138;
        if (uVar138 != 0) {
          local_58 = fVar216;
          fStack_54 = fVar288;
          fStack_50 = fVar297;
          fStack_4c = fVar300;
          local_4f8 = auVar66._0_4_;
          fStack_4f4 = auVar66._4_4_;
          fStack_4f0 = auVar66._8_4_;
          fVar379 = local_4f8 * fVar215 + fVar299 * local_368 + fVar345 * fVar390 +
                    fVar319 * fVar410;
          fVar380 = fStack_4f4 * fVar215 + fVar363 * fStack_364 + fVar347 * fVar390 +
                    fVar320 * fVar410;
          fVar387 = fStack_4f0 * fVar215 + fVar302 * fStack_360 + fVar290 * fVar390 +
                    fVar323 * fVar410;
          fVar388 = fVar430 * fVar215 + fVar365 * fStack_35c + fVar358 * fVar390 + fVar343 * fVar410
          ;
          local_2f8 = auVar63._0_4_;
          fStack_2f4 = auVar63._4_4_;
          fStack_2f0 = auVar63._8_4_;
          fVar220 = fVar334 * fVar215 + local_2f8 * local_368 + local_388 * fVar390 +
                    fVar221 * fVar410;
          fVar222 = fVar403 * fVar215 + fStack_2f4 * fStack_364 + fStack_384 * fVar390 +
                    fVar296 * fVar410;
          fVar254 = fVar341 * fVar215 + fStack_2f0 * fStack_360 + fStack_380 * fVar390 +
                    fVar306 * fVar410;
          fVar256 = fVar338 * fVar215 + fVar332 * fStack_35c + fStack_37c * fVar390 +
                    fVar318 * fVar410;
          pfVar1 = (float *)(lVar129 + 0x2200d38 + lVar132 * 4);
          fVar221 = *pfVar1;
          fVar296 = pfVar1[1];
          fVar306 = pfVar1[2];
          fVar318 = pfVar1[3];
          pfVar1 = (float *)(lVar129 + 0x22011bc + lVar132 * 4);
          fVar319 = *pfVar1;
          fVar320 = pfVar1[1];
          fVar323 = pfVar1[2];
          fVar332 = pfVar1[3];
          pfVar1 = (float *)(lVar129 + 0x2201640 + lVar132 * 4);
          fVar334 = *pfVar1;
          fVar403 = pfVar1[1];
          fVar341 = pfVar1[2];
          fVar338 = pfVar1[3];
          pfVar1 = (float *)(lVar129 + 0x2201ac4 + lVar132 * 4);
          fVar343 = *pfVar1;
          fVar345 = pfVar1[1];
          fVar347 = pfVar1[2];
          fVar290 = pfVar1[3];
          fVar304 = fVar351 * fVar221 + fVar373 * fVar319 + fVar348 * fVar334 + fVar253 * fVar343;
          fVar370 = fVar351 * fVar296 + fVar373 * fVar320 + fVar348 * fVar403 + fVar253 * fVar345;
          fVar374 = fVar351 * fVar306 + fVar373 * fVar323 + fVar348 * fVar341 + fVar253 * fVar347;
          fVar376 = fVar351 * fVar318 + fVar373 * fVar332 + fVar348 * fVar338 + fVar253 * fVar290;
          fVar389 = fVar386 * fVar221 +
                    local_378 * fVar319 + local_358 * fVar334 + fVar255 * fVar343;
          fVar147 = fVar386 * fVar296 +
                    fStack_374 * fVar320 + fStack_354 * fVar403 + fVar255 * fVar345;
          fVar213 = fVar386 * fVar306 +
                    fStack_370 * fVar323 + fStack_350 * fVar341 + fVar255 * fVar347;
          fVar217 = fVar386 * fVar318 +
                    fStack_36c * fVar332 + fStack_34c * fVar338 + fVar255 * fVar290;
          pfVar1 = (float *)(lVar129 + 0x2203158 + lVar132 * 4);
          fVar358 = *pfVar1;
          fVar299 = pfVar1[1];
          fVar363 = pfVar1[2];
          fVar302 = pfVar1[3];
          pfVar1 = (float *)(lVar129 + 0x2203a60 + lVar132 * 4);
          fVar365 = *pfVar1;
          fVar430 = pfVar1[1];
          fVar349 = pfVar1[2];
          fVar354 = pfVar1[3];
          pfVar1 = (float *)(lVar129 + 0x2203ee4 + lVar132 * 4);
          fVar423 = *pfVar1;
          fVar428 = pfVar1[1];
          fVar431 = pfVar1[2];
          fVar432 = pfVar1[3];
          pfVar1 = (float *)(lVar129 + 0x22035dc + lVar132 * 4);
          fVar435 = *pfVar1;
          fVar436 = pfVar1[1];
          fVar375 = pfVar1[2];
          fVar377 = pfVar1[3];
          fVar378 = fVar351 * fVar358 + fVar373 * fVar435 + fVar348 * fVar365 + fVar253 * fVar423;
          fVar416 = fVar351 * fVar299 + fVar373 * fVar436 + fVar348 * fVar430 + fVar253 * fVar428;
          fVar420 = fVar351 * fVar363 + fVar373 * fVar375 + fVar348 * fVar349 + fVar253 * fVar431;
          fVar421 = fVar351 * fVar302 + fVar373 * fVar377 + fVar348 * fVar354 + fVar253 * fVar432;
          fVar257 = fVar386 * fVar358 +
                    local_378 * fVar435 + local_358 * fVar365 + fVar255 * fVar423;
          fVar289 = fVar386 * fVar299 +
                    fStack_374 * fVar436 + fStack_354 * fVar430 + fVar255 * fVar428;
          fVar298 = fVar386 * fVar363 +
                    fStack_370 * fVar375 + fStack_350 * fVar349 + fVar255 * fVar431;
          fVar301 = fVar386 * fVar302 +
                    fStack_36c * fVar377 + fStack_34c * fVar354 + fVar255 * fVar432;
          auVar399._0_8_ = CONCAT44(fVar370,fVar304) & 0x7fffffff7fffffff;
          auVar399._8_4_ = ABS(fVar374);
          auVar399._12_4_ = ABS(fVar376);
          auVar328._0_8_ = CONCAT44(fVar147,fVar389) & 0x7fffffff7fffffff;
          auVar328._8_4_ = ABS(fVar213);
          auVar328._12_4_ = ABS(fVar217);
          auVar174 = maxps(auVar399,auVar328);
          auVar408._0_8_ =
               CONCAT44(fVar296 * fVar410 +
                        fVar320 * fVar390 + fVar403 * fStack_364 + fVar345 * fVar215,
                        fVar221 * fVar410 +
                        fVar319 * fVar390 + fVar334 * local_368 + fVar343 * fVar215) &
               0x7fffffff7fffffff;
          auVar408._8_4_ =
               ABS(fVar306 * fVar410 + fVar323 * fVar390 + fVar341 * fStack_360 + fVar347 * fVar215)
          ;
          auVar408._12_4_ =
               ABS(fVar318 * fVar410 + fVar332 * fVar390 + fVar338 * fStack_35c + fVar290 * fVar215)
          ;
          auVar174 = maxps(auVar174,auVar408);
          uVar138 = -(uint)(local_428 <= auVar174._0_4_);
          uVar140 = -(uint)(local_428 <= auVar174._4_4_);
          uVar141 = -(uint)(local_428 <= auVar174._8_4_);
          uVar142 = -(uint)(local_428 <= auVar174._12_4_);
          auVar329._0_4_ = ~uVar138 & (uint)fVar216;
          auVar329._4_4_ = ~uVar140 & (uint)fVar288;
          auVar329._8_4_ = ~uVar141 & (uint)fVar297;
          auVar329._12_4_ = ~uVar142 & (uint)fVar300;
          auVar384._0_4_ = (uint)fVar304 & uVar138;
          auVar384._4_4_ = (uint)fVar370 & uVar140;
          auVar384._8_4_ = (uint)fVar374 & uVar141;
          auVar384._12_4_ = (uint)fVar376 & uVar142;
          auVar384 = auVar384 | auVar329;
          fVar389 = (float)(~uVar138 & (uint)fVar305 | (uint)fVar389 & uVar138);
          fVar147 = (float)(~uVar140 & (uint)fVar367 | (uint)fVar147 & uVar140);
          fVar213 = (float)(~uVar141 & (uint)fVar425 | (uint)fVar213 & uVar141);
          fVar217 = (float)(~uVar142 & (uint)fVar146 | (uint)fVar217 & uVar142);
          auVar409._0_8_ = CONCAT44(fVar416,fVar378) & 0x7fffffff7fffffff;
          auVar409._8_4_ = ABS(fVar420);
          auVar409._12_4_ = ABS(fVar421);
          auVar281._0_8_ = CONCAT44(fVar289,fVar257) & 0x7fffffff7fffffff;
          auVar281._8_4_ = ABS(fVar298);
          auVar281._12_4_ = ABS(fVar301);
          auVar174 = maxps(auVar409,auVar281);
          auVar201._0_8_ =
               CONCAT44(fVar299 * fVar410 +
                        fVar436 * fVar390 + fVar430 * fStack_364 + fVar428 * fVar215,
                        fVar358 * fVar410 +
                        fVar435 * fVar390 + fVar365 * local_368 + fVar423 * fVar215) &
               0x7fffffff7fffffff;
          auVar201._8_4_ =
               ABS(fVar363 * fVar410 + fVar375 * fVar390 + fVar349 * fStack_360 + fVar431 * fVar215)
          ;
          auVar201._12_4_ =
               ABS(fVar302 * fVar410 + fVar377 * fVar390 + fVar354 * fStack_35c + fVar432 * fVar215)
          ;
          auVar174 = maxps(auVar174,auVar201);
          uVar138 = -(uint)(local_428 <= auVar174._0_4_);
          uVar140 = -(uint)(local_428 <= auVar174._4_4_);
          uVar141 = -(uint)(local_428 <= auVar174._8_4_);
          uVar142 = -(uint)(local_428 <= auVar174._12_4_);
          fVar430 = (float)((uint)fVar378 & uVar138 | ~uVar138 & (uint)fVar216);
          fVar216 = (float)((uint)fVar416 & uVar140 | ~uVar140 & (uint)fVar288);
          fVar288 = (float)((uint)fVar420 & uVar141 | ~uVar141 & (uint)fVar297);
          fVar297 = (float)((uint)fVar421 & uVar142 | ~uVar142 & (uint)fVar300);
          fVar358 = (float)(~uVar138 & (uint)fVar305 | (uint)fVar257 & uVar138);
          fVar363 = (float)(~uVar140 & (uint)fVar367 | (uint)fVar289 & uVar140);
          fVar365 = (float)(~uVar141 & (uint)fVar425 | (uint)fVar298 & uVar141);
          fVar367 = (float)(~uVar142 & (uint)fVar146 | (uint)fVar301 & uVar142);
          fVar332 = auVar384._0_4_;
          fVar221 = auVar384._4_4_;
          fVar296 = auVar384._8_4_;
          fVar306 = auVar384._12_4_;
          auVar314._0_4_ = fVar389 * fVar389 + fVar332 * fVar332;
          auVar314._4_4_ = fVar147 * fVar147 + fVar221 * fVar221;
          auVar314._8_4_ = fVar213 * fVar213 + fVar296 * fVar296;
          auVar314._12_4_ = fVar217 * fVar217 + fVar306 * fVar306;
          auVar174 = rsqrtps(auVar329,auVar314);
          fVar318 = auVar174._0_4_;
          fVar319 = auVar174._4_4_;
          fVar320 = auVar174._8_4_;
          fVar323 = auVar174._12_4_;
          auVar330._0_4_ = fVar318 * fVar318 * auVar314._0_4_ * 0.5 * fVar318;
          auVar330._4_4_ = fVar319 * fVar319 * auVar314._4_4_ * 0.5 * fVar319;
          auVar330._8_4_ = fVar320 * fVar320 * auVar314._8_4_ * 0.5 * fVar320;
          auVar330._12_4_ = fVar323 * fVar323 * auVar314._12_4_ * 0.5 * fVar323;
          fVar343 = fVar318 * 1.5 - auVar330._0_4_;
          fVar345 = fVar319 * 1.5 - auVar330._4_4_;
          fVar347 = fVar320 * 1.5 - auVar330._8_4_;
          fVar290 = fVar323 * 1.5 - auVar330._12_4_;
          auVar315._0_4_ = fVar358 * fVar358 + fVar430 * fVar430;
          auVar315._4_4_ = fVar363 * fVar363 + fVar216 * fVar216;
          auVar315._8_4_ = fVar365 * fVar365 + fVar288 * fVar288;
          auVar315._12_4_ = fVar367 * fVar367 + fVar297 * fVar297;
          auVar174 = rsqrtps(auVar330,auVar315);
          fVar318 = auVar174._0_4_;
          fVar319 = auVar174._4_4_;
          fVar320 = auVar174._8_4_;
          fVar323 = auVar174._12_4_;
          fVar334 = fVar318 * 1.5 - fVar318 * fVar318 * auVar315._0_4_ * 0.5 * fVar318;
          fVar403 = fVar319 * 1.5 - fVar319 * fVar319 * auVar315._4_4_ * 0.5 * fVar319;
          fVar341 = fVar320 * 1.5 - fVar320 * fVar320 * auVar315._8_4_ * 0.5 * fVar320;
          fVar338 = fVar323 * 1.5 - fVar323 * fVar323 * auVar315._12_4_ * 0.5 * fVar323;
          fVar146 = fVar389 * fVar343 * auVar250._0_4_;
          fVar377 = fVar147 * fVar345 * auVar250._4_4_;
          fVar147 = fVar213 * fVar347 * auVar250._8_4_;
          fVar217 = fVar217 * fVar290 * auVar250._12_4_;
          fVar319 = -fVar332 * fVar343 * auVar250._0_4_;
          fVar320 = -fVar221 * fVar345 * auVar250._4_4_;
          fVar323 = -fVar296 * fVar347 * auVar250._8_4_;
          fVar332 = -fVar306 * fVar290 * auVar250._12_4_;
          fVar299 = fVar343 * 0.0 * auVar250._0_4_;
          fVar302 = fVar345 * 0.0 * auVar250._4_4_;
          fVar305 = fVar347 * 0.0 * auVar250._8_4_;
          fVar425 = fVar290 * 0.0 * auVar250._12_4_;
          fVar300 = fVar358 * fVar334 * auVar418._0_4_;
          fVar289 = fVar363 * fVar403 * auVar418._4_4_;
          fVar298 = fVar365 * fVar341 * auVar418._8_4_;
          fVar301 = fVar367 * fVar338 * auVar418._12_4_;
          fVar349 = fVar212 + fVar300;
          fVar354 = fVar219 + fVar289;
          fVar423 = fVar324 + fVar298;
          fVar428 = fVar333 + fVar301;
          fVar221 = -fVar430 * fVar334 * auVar418._0_4_;
          fVar296 = -fVar216 * fVar403 * auVar418._4_4_;
          fVar306 = -fVar288 * fVar341 * auVar418._8_4_;
          fVar318 = -fVar297 * fVar338 * auVar418._12_4_;
          fVar431 = fVar335 + fVar221;
          fVar432 = fVar303 + fVar296;
          fVar435 = fVar336 + fVar306;
          fVar436 = fVar321 + fVar318;
          fVar343 = fVar334 * 0.0 * auVar418._0_4_;
          fVar345 = fVar403 * 0.0 * auVar418._4_4_;
          fVar347 = fVar341 * 0.0 * auVar418._8_4_;
          fVar290 = fVar338 * 0.0 * auVar418._12_4_;
          fVar358 = fVar322 - fVar146;
          fVar363 = fVar337 - fVar377;
          fVar365 = fVar342 - fVar147;
          fVar367 = fVar344 - fVar217;
          fVar375 = fVar379 + fVar343;
          fVar389 = fVar380 + fVar345;
          fVar213 = fVar387 + fVar347;
          fVar257 = fVar388 + fVar290;
          fVar430 = fVar346 - fVar319;
          fVar216 = fVar352 - fVar320;
          fVar288 = fVar356 - fVar323;
          fVar297 = fVar427 - fVar332;
          fVar334 = fVar220 - fVar299;
          fVar403 = fVar222 - fVar302;
          fVar341 = fVar254 - fVar305;
          fVar338 = fVar256 - fVar425;
          uVar138 = -(uint)(0.0 < (fVar430 * (fVar375 - fVar334) - fVar334 * (fVar431 - fVar430)) *
                                  0.0 + (fVar334 * (fVar349 - fVar358) -
                                        (fVar375 - fVar334) * fVar358) * 0.0 +
                                        ((fVar431 - fVar430) * fVar358 -
                                        (fVar349 - fVar358) * fVar430));
          uVar140 = -(uint)(0.0 < (fVar216 * (fVar389 - fVar403) - fVar403 * (fVar432 - fVar216)) *
                                  0.0 + (fVar403 * (fVar354 - fVar363) -
                                        (fVar389 - fVar403) * fVar363) * 0.0 +
                                        ((fVar432 - fVar216) * fVar363 -
                                        (fVar354 - fVar363) * fVar216));
          uVar141 = -(uint)(0.0 < (fVar288 * (fVar213 - fVar341) - fVar341 * (fVar435 - fVar288)) *
                                  0.0 + (fVar341 * (fVar423 - fVar365) -
                                        (fVar213 - fVar341) * fVar365) * 0.0 +
                                        ((fVar435 - fVar288) * fVar365 -
                                        (fVar423 - fVar365) * fVar288));
          uVar142 = -(uint)(0.0 < (fVar297 * (fVar257 - fVar338) - fVar338 * (fVar436 - fVar297)) *
                                  0.0 + (fVar338 * (fVar428 - fVar367) -
                                        (fVar257 - fVar338) * fVar367) * 0.0 +
                                        ((fVar436 - fVar297) * fVar367 -
                                        (fVar428 - fVar367) * fVar297));
          fVar300 = (float)((uint)(fVar212 - fVar300) & uVar138 |
                           ~uVar138 & (uint)(fVar322 + fVar146));
          fVar322 = (float)((uint)(fVar219 - fVar289) & uVar140 |
                           ~uVar140 & (uint)(fVar337 + fVar377));
          fVar337 = (float)((uint)(fVar324 - fVar298) & uVar141 |
                           ~uVar141 & (uint)(fVar342 + fVar147));
          fVar333 = (float)((uint)(fVar333 - fVar301) & uVar142 |
                           ~uVar142 & (uint)(fVar344 + fVar217));
          fVar377 = (float)((uint)(fVar335 - fVar221) & uVar138 |
                           ~uVar138 & (uint)(fVar346 + fVar319));
          fVar352 = (float)((uint)(fVar303 - fVar296) & uVar140 |
                           ~uVar140 & (uint)(fVar352 + fVar320));
          fVar356 = (float)((uint)(fVar336 - fVar306) & uVar141 |
                           ~uVar141 & (uint)(fVar356 + fVar323));
          fVar427 = (float)((uint)(fVar321 - fVar318) & uVar142 |
                           ~uVar142 & (uint)(fVar427 + fVar332));
          fVar319 = (float)((uint)(fVar379 - fVar343) & uVar138 |
                           ~uVar138 & (uint)(fVar220 + fVar299));
          fVar320 = (float)((uint)(fVar380 - fVar345) & uVar140 |
                           ~uVar140 & (uint)(fVar222 + fVar302));
          fVar323 = (float)((uint)(fVar387 - fVar347) & uVar141 |
                           ~uVar141 & (uint)(fVar254 + fVar305));
          fVar332 = (float)((uint)(fVar388 - fVar290) & uVar142 |
                           ~uVar142 & (uint)(fVar256 + fVar425));
          fVar299 = (float)((uint)fVar358 & uVar138 | ~uVar138 & (uint)fVar349);
          fVar302 = (float)((uint)fVar363 & uVar140 | ~uVar140 & (uint)fVar354);
          fVar305 = (float)((uint)fVar365 & uVar141 | ~uVar141 & (uint)fVar423);
          fVar425 = (float)((uint)fVar367 & uVar142 | ~uVar142 & (uint)fVar428);
          fVar146 = (float)((uint)fVar430 & uVar138 | ~uVar138 & (uint)fVar431);
          fVar212 = (float)((uint)fVar216 & uVar140 | ~uVar140 & (uint)fVar432);
          fVar219 = (float)((uint)fVar288 & uVar141 | ~uVar141 & (uint)fVar435);
          fVar324 = (float)((uint)fVar297 & uVar142 | ~uVar142 & (uint)fVar436);
          fVar343 = (float)((uint)fVar334 & uVar138 | ~uVar138 & (uint)fVar375);
          fVar345 = (float)((uint)fVar403 & uVar140 | ~uVar140 & (uint)fVar389);
          fVar347 = (float)((uint)fVar341 & uVar141 | ~uVar141 & (uint)fVar213);
          fVar290 = (float)((uint)fVar338 & uVar142 | ~uVar142 & (uint)fVar257);
          fVar358 = (float)((uint)fVar349 & uVar138 | ~uVar138 & (uint)fVar358) - fVar300;
          fVar363 = (float)((uint)fVar354 & uVar140 | ~uVar140 & (uint)fVar363) - fVar322;
          fVar365 = (float)((uint)fVar423 & uVar141 | ~uVar141 & (uint)fVar365) - fVar337;
          fVar367 = (float)((uint)fVar428 & uVar142 | ~uVar142 & (uint)fVar367) - fVar333;
          fVar430 = (float)((uint)fVar431 & uVar138 | ~uVar138 & (uint)fVar430) - fVar377;
          fVar216 = (float)((uint)fVar432 & uVar140 | ~uVar140 & (uint)fVar216) - fVar352;
          fVar288 = (float)((uint)fVar435 & uVar141 | ~uVar141 & (uint)fVar288) - fVar356;
          fVar297 = (float)((uint)fVar436 & uVar142 | ~uVar142 & (uint)fVar297) - fVar427;
          fVar335 = (float)((uint)fVar375 & uVar138 | ~uVar138 & (uint)fVar334) - fVar319;
          fVar303 = (float)((uint)fVar389 & uVar140 | ~uVar140 & (uint)fVar403) - fVar320;
          fVar336 = (float)((uint)fVar213 & uVar141 | ~uVar141 & (uint)fVar341) - fVar323;
          fVar321 = (float)((uint)fVar257 & uVar142 | ~uVar142 & (uint)fVar338) - fVar332;
          fVar354 = fVar300 - fVar299;
          fVar423 = fVar322 - fVar302;
          fVar428 = fVar337 - fVar305;
          fVar431 = fVar333 - fVar425;
          fVar221 = fVar377 - fVar146;
          fVar296 = fVar352 - fVar212;
          fVar306 = fVar356 - fVar219;
          fVar318 = fVar427 - fVar324;
          fVar334 = fVar319 - fVar343;
          fVar403 = fVar320 - fVar345;
          fVar341 = fVar323 - fVar347;
          fVar338 = fVar332 - fVar290;
          fVar342 = (fVar377 * fVar335 - fVar319 * fVar430) * 0.0 +
                    (fVar319 * fVar358 - fVar300 * fVar335) * 0.0 +
                    (fVar300 * fVar430 - fVar377 * fVar358);
          fVar344 = (fVar352 * fVar303 - fVar320 * fVar216) * 0.0 +
                    (fVar320 * fVar363 - fVar322 * fVar303) * 0.0 +
                    (fVar322 * fVar216 - fVar352 * fVar363);
          auVar294._4_4_ = fVar344;
          auVar294._0_4_ = fVar342;
          fVar346 = (fVar356 * fVar336 - fVar323 * fVar288) * 0.0 +
                    (fVar323 * fVar365 - fVar337 * fVar336) * 0.0 +
                    (fVar337 * fVar288 - fVar356 * fVar365);
          fVar349 = (fVar427 * fVar321 - fVar332 * fVar297) * 0.0 +
                    (fVar332 * fVar367 - fVar333 * fVar321) * 0.0 +
                    (fVar333 * fVar297 - fVar427 * fVar367);
          auVar419._0_4_ =
               (fVar146 * fVar334 - fVar343 * fVar221) * 0.0 +
               (fVar343 * fVar354 - fVar299 * fVar334) * 0.0 +
               (fVar299 * fVar221 - fVar146 * fVar354);
          auVar419._4_4_ =
               (fVar212 * fVar403 - fVar345 * fVar296) * 0.0 +
               (fVar345 * fVar423 - fVar302 * fVar403) * 0.0 +
               (fVar302 * fVar296 - fVar212 * fVar423);
          auVar419._8_4_ =
               (fVar219 * fVar341 - fVar347 * fVar306) * 0.0 +
               (fVar347 * fVar428 - fVar305 * fVar341) * 0.0 +
               (fVar305 * fVar306 - fVar219 * fVar428);
          auVar419._12_4_ =
               (fVar324 * fVar338 - fVar290 * fVar318) * 0.0 +
               (fVar290 * fVar431 - fVar425 * fVar338) * 0.0 +
               (fVar425 * fVar318 - fVar324 * fVar431);
          auVar294._8_4_ = fVar346;
          auVar294._12_4_ = fVar349;
          auVar174 = maxps(auVar294,auVar419);
          bVar100 = auVar174._0_4_ <= 0.0 && bVar100;
          auVar295._0_4_ = -(uint)bVar100;
          bVar101 = auVar174._4_4_ <= 0.0 && bVar101;
          auVar295._4_4_ = -(uint)bVar101;
          bVar95 = auVar174._8_4_ <= 0.0 && bVar95;
          auVar295._8_4_ = -(uint)bVar95;
          bVar90 = auVar174._12_4_ <= 0.0 && bVar90;
          auVar295._12_4_ = -(uint)bVar90;
          iVar207 = movmskps((int)(bspline_basis1 + lVar129),auVar295);
          if (iVar207 == 0) {
LAB_0038ad99:
            auVar283._8_8_ = uStack_390;
            auVar283._0_8_ = local_398;
          }
          else {
            fVar345 = fVar221 * fVar335 - fVar334 * fVar430;
            fVar347 = fVar296 * fVar303 - fVar403 * fVar216;
            fVar290 = fVar306 * fVar336 - fVar341 * fVar288;
            fVar299 = fVar318 * fVar321 - fVar338 * fVar297;
            fVar343 = fVar334 * fVar358 - fVar335 * fVar354;
            fVar403 = fVar403 * fVar363 - fVar303 * fVar423;
            fVar341 = fVar341 * fVar365 - fVar336 * fVar428;
            fVar338 = fVar338 * fVar367 - fVar321 * fVar431;
            fVar221 = fVar354 * fVar430 - fVar221 * fVar358;
            fVar358 = fVar423 * fVar216 - fVar296 * fVar363;
            fVar363 = fVar428 * fVar288 - fVar306 * fVar365;
            fVar302 = fVar431 * fVar297 - fVar318 * fVar367;
            auVar282._0_4_ = fVar343 * 0.0 + fVar221;
            auVar282._4_4_ = fVar403 * 0.0 + fVar358;
            auVar282._8_4_ = fVar341 * 0.0 + fVar363;
            auVar282._12_4_ = fVar338 * 0.0 + fVar302;
            auVar340._0_4_ = fVar345 * 0.0 + auVar282._0_4_;
            auVar340._4_4_ = fVar347 * 0.0 + auVar282._4_4_;
            auVar340._8_4_ = fVar290 * 0.0 + auVar282._8_4_;
            auVar340._12_4_ = fVar299 * 0.0 + auVar282._12_4_;
            auVar174 = rcpps(auVar282,auVar340);
            fVar296 = auVar174._0_4_;
            fVar306 = auVar174._4_4_;
            fVar318 = auVar174._8_4_;
            fVar334 = auVar174._12_4_;
            fVar296 = (1.0 - auVar340._0_4_ * fVar296) * fVar296 + fVar296;
            fVar306 = (1.0 - auVar340._4_4_ * fVar306) * fVar306 + fVar306;
            fVar318 = (1.0 - auVar340._8_4_ * fVar318) * fVar318 + fVar318;
            fVar334 = (1.0 - auVar340._12_4_ * fVar334) * fVar334 + fVar334;
            fVar319 = (fVar319 * fVar221 + fVar377 * fVar343 + fVar300 * fVar345) * fVar296;
            fVar320 = (fVar320 * fVar358 + fVar352 * fVar403 + fVar322 * fVar347) * fVar306;
            fVar323 = (fVar323 * fVar363 + fVar356 * fVar341 + fVar337 * fVar290) * fVar318;
            fVar332 = (fVar332 * fVar302 + fVar427 * fVar338 + fVar333 * fVar299) * fVar334;
            fVar221 = *(float *)(ray + k * 4 + 0x80);
            bVar100 = (fVar211 <= fVar319 && fVar319 <= fVar221) && bVar100;
            auVar316._0_4_ = -(uint)bVar100;
            bVar101 = (fVar211 <= fVar320 && fVar320 <= fVar221) && bVar101;
            auVar316._4_4_ = -(uint)bVar101;
            bVar95 = (fVar211 <= fVar323 && fVar323 <= fVar221) && bVar95;
            auVar316._8_4_ = -(uint)bVar95;
            bVar90 = (fVar211 <= fVar332 && fVar332 <= fVar221) && bVar90;
            auVar316._12_4_ = -(uint)bVar90;
            iVar207 = movmskps(iVar207,auVar316);
            if (iVar207 == 0) goto LAB_0038ad99;
            auVar317._0_8_ =
                 CONCAT44(-(uint)(auVar340._4_4_ != 0.0 && bVar101),
                          -(uint)(auVar340._0_4_ != 0.0 && bVar100));
            auVar317._8_4_ = -(uint)(auVar340._8_4_ != 0.0 && bVar95);
            auVar317._12_4_ = -(uint)(auVar340._12_4_ != 0.0 && bVar90);
            iVar207 = movmskps(iVar207,auVar317);
            auVar283._8_8_ = uStack_390;
            auVar283._0_8_ = local_398;
            if (iVar207 != 0) {
              fVar342 = fVar342 * fVar296;
              fVar344 = fVar344 * fVar306;
              fVar346 = fVar346 * fVar318;
              fVar349 = fVar349 * fVar334;
              auVar202._0_4_ = ~uVar138 & (uint)fVar342;
              auVar202._4_4_ = ~uVar140 & (uint)fVar344;
              auVar202._8_4_ = ~uVar141 & (uint)fVar346;
              auVar202._12_4_ = ~uVar142 & (uint)fVar349;
              auVar385._0_4_ = (uint)(1.0 - fVar342) & uVar138;
              auVar385._4_4_ = (uint)(1.0 - fVar344) & uVar140;
              auVar385._8_4_ = (uint)(1.0 - fVar346) & uVar141;
              auVar385._12_4_ = (uint)(1.0 - fVar349) & uVar142;
              aVar383 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)(auVar385 | auVar202);
              local_288 = (float)(~uVar138 & (uint)(auVar419._0_4_ * fVar296) |
                                 (uint)(1.0 - auVar419._0_4_ * fVar296) & uVar138);
              fStack_284 = (float)(~uVar140 & (uint)(auVar419._4_4_ * fVar306) |
                                  (uint)(1.0 - auVar419._4_4_ * fVar306) & uVar140);
              fStack_280 = (float)(~uVar141 & (uint)(auVar419._8_4_ * fVar318) |
                                  (uint)(1.0 - auVar419._8_4_ * fVar318) & uVar141);
              fStack_27c = (float)(~uVar142 & (uint)(auVar419._12_4_ * fVar334) |
                                  (uint)(1.0 - auVar419._12_4_ * fVar334) & uVar142);
              auVar283._8_4_ = auVar317._8_4_;
              auVar283._0_8_ = auVar317._0_8_;
              auVar283._12_4_ = auVar317._12_4_;
              fVar412 = fVar319;
              fVar144 = fVar320;
              fVar145 = fVar323;
              fVar206 = fVar332;
            }
          }
          iVar207 = movmskps(iVar207,auVar283);
          if (iVar207 != 0) {
            fVar296 = (auVar418._0_4_ - auVar250._0_4_) * aVar383.v[0] + auVar250._0_4_;
            fVar306 = (auVar418._4_4_ - auVar250._4_4_) * aVar383.v[1] + auVar250._4_4_;
            fVar318 = (auVar418._8_4_ - auVar250._8_4_) * aVar383.v[2] + auVar250._8_4_;
            fVar319 = (auVar418._12_4_ - auVar250._12_4_) * aVar383.v[3] + auVar250._12_4_;
            fVar221 = *(float *)((long)local_3b0->ray_space + k * 4 + -0x10);
            aVar203._0_4_ = -(uint)(fVar221 * (fVar296 + fVar296) < fVar412) & auVar283._0_4_;
            aVar203._4_4_ = -(uint)(fVar221 * (fVar306 + fVar306) < fVar144) & auVar283._4_4_;
            aVar203._8_4_ = -(uint)(fVar221 * (fVar318 + fVar318) < fVar145) & auVar283._8_4_;
            aVar203._12_4_ = -(uint)(fVar221 * (fVar319 + fVar319) < fVar206) & auVar283._12_4_;
            uVar138 = movmskps((int)local_3b0,(undefined1  [16])aVar203);
            if (uVar138 != 0) {
              local_288 = local_288 + local_288 + -1.0;
              fStack_284 = fStack_284 + fStack_284 + -1.0;
              fStack_280 = fStack_280 + fStack_280 + -1.0;
              fStack_27c = fStack_27c + fStack_27c + -1.0;
              bhit.T.field_0.v[1] = fVar144;
              bhit.T.field_0.v[0] = fVar412;
              bhit.T.field_0.v[2] = fVar145;
              bhit.T.field_0.v[3] = fVar206;
              bhit.curve3D.v0.field_0._0_8_ = CONCAT44(fVar426,fVar400);
              bhit.curve3D.v0.field_0._8_8_ = CONCAT44(fVar355,fVar353);
              bhit.curve3D.v1.field_0._0_8_ = CONCAT44(fVar414,fVar413);
              bhit.curve3D.v1.field_0._8_8_ = CONCAT44(fVar434,fVar415);
              bhit.curve3D.v2.field_0._0_8_ = CONCAT44(fVar362,fVar357);
              bhit.curve3D.v2.field_0._8_8_ = CONCAT44(fVar366,fVar364);
              bhit.curve3D.v3.field_0._0_8_ = CONCAT44(fVar402,fVar401);
              bhit.curve3D.v3.field_0._8_8_ = CONCAT44(fVar411,fVar404);
              pGVar26 = (context->scene->geometries).items[local_3a8].ptr;
              uVar131 = local_3a8;
              bhit.U.field_0 = aVar383;
              bhit.V.field_0.v[0] = local_288;
              bhit.V.field_0.v[1] = fStack_284;
              bhit.V.field_0.v[2] = fStack_280;
              bhit.V.field_0.v[3] = fStack_27c;
              bhit.i = uVar139;
              bhit.valid.field_0 = aVar203;
              if ((pGVar26->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                pRVar130 = (RTCIntersectArguments *)0x0;
                bhit.N = iVar286;
              }
              else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                      (pRVar130 = (RTCIntersectArguments *)
                                  CONCAT71((int7)((ulong)context->args >> 8),1), bhit.N = iVar286,
                      pGVar26->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar221 = (float)(int)uVar139;
                bhit.vu.field_0.v[0] = (fVar221 + aVar383.v[0] + 0.0) * local_98;
                bhit.vu.field_0.v[1] = (fVar221 + aVar383.v[1] + 1.0) * fStack_94;
                bhit.vu.field_0.v[2] = (fVar221 + aVar383.v[2] + 2.0) * fStack_90;
                bhit.vu.field_0.v[3] = (fVar221 + aVar383.v[3] + 3.0) * fStack_8c;
                bhit.vv.field_0._0_8_ = CONCAT44(fStack_284,local_288);
                bhit.vv.field_0._8_8_ = CONCAT44(fStack_27c,fStack_280);
                bhit.vt.field_0.v[1] = fVar144;
                bhit.vt.field_0.v[0] = fVar412;
                bhit.vt.field_0.v[2] = fVar145;
                bhit.vt.field_0.v[3] = fVar206;
                uVar131 = (ulong)(uVar138 & 0xff);
                uVar135 = 0;
                if (uVar131 != 0) {
                  for (; ((uVar138 & 0xff) >> uVar135 & 1) == 0; uVar135 = uVar135 + 1) {
                  }
                }
                auVar174 = *local_340;
                bhit.N = iVar286;
                while (uVar131 != 0) {
                  local_f8 = bhit.vu.field_0.v[uVar135];
                  uVar133 = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_e8 = bhit.vv.field_0.v[uVar135];
                  *(float *)(ray + k * 4 + 0x80) = bhit.vt.field_0.v[uVar135];
                  fVar318 = 1.0 - local_f8;
                  fVar221 = local_f8 * fVar318 * 4.0;
                  fVar319 = (fVar318 * fVar318 + fVar221) * 0.5;
                  fVar296 = local_f8 * local_f8 * 0.5;
                  fVar306 = (-local_f8 * local_f8 - fVar221) * 0.5;
                  args.context = context->user;
                  fVar221 = -fVar318 * fVar318 * 0.5;
                  local_128 = fVar221 * fVar400 +
                              fVar306 * fVar413 + fVar319 * fVar357 + fVar296 * fVar401;
                  local_118 = fVar221 * fVar426 +
                              fVar306 * fVar414 + fVar319 * fVar362 + fVar296 * fVar402;
                  local_108 = fVar221 * fVar353 +
                              fVar306 * fVar415 + fVar319 * fVar364 + fVar296 * fVar404;
                  fStack_124 = local_128;
                  fStack_120 = local_128;
                  fStack_11c = local_128;
                  fStack_114 = local_118;
                  fStack_110 = local_118;
                  fStack_10c = local_118;
                  fStack_104 = local_108;
                  fStack_100 = local_108;
                  fStack_fc = local_108;
                  fStack_f4 = local_f8;
                  fStack_f0 = local_f8;
                  fStack_ec = local_f8;
                  fStack_e4 = local_e8;
                  fStack_e0 = local_e8;
                  fStack_dc = local_e8;
                  local_d8 = CONCAT44(uStack_84,local_88);
                  uStack_d0 = CONCAT44(uStack_7c,uStack_80);
                  local_c8 = CONCAT44(uStack_74,local_78);
                  uStack_c0 = CONCAT44(uStack_6c,uStack_70);
                  local_b8 = (args.context)->instID[0];
                  uStack_b4 = local_b8;
                  uStack_b0 = local_b8;
                  uStack_ac = local_b8;
                  local_a8 = (args.context)->instPrimID[0];
                  uStack_a4 = local_a8;
                  uStack_a0 = local_a8;
                  uStack_9c = local_a8;
                  args.valid = (int *)local_3c8;
                  pRVar130 = (RTCIntersectArguments *)pGVar26->userPtr;
                  args.hit = (RTCHitN *)&local_128;
                  args.N = 4;
                  p_Var127 = pGVar26->occlusionFilterN;
                  local_3c8 = auVar174;
                  args.geometryUserPtr = pRVar130;
                  args.ray = (RTCRayN *)ray;
                  if (p_Var127 != (RTCFilterFunctionN)0x0) {
                    p_Var127 = (RTCFilterFunctionN)(*p_Var127)(&args);
                  }
                  auVar251._0_4_ = -(uint)(local_3c8._0_4_ == 0);
                  auVar251._4_4_ = -(uint)(local_3c8._4_4_ == 0);
                  auVar251._8_4_ = -(uint)(local_3c8._8_4_ == 0);
                  auVar251._12_4_ = -(uint)(local_3c8._12_4_ == 0);
                  uVar138 = movmskps((int)p_Var127,auVar251);
                  pRVar128 = (RTCRayN *)(ulong)(uVar138 ^ 0xf);
                  if ((uVar138 ^ 0xf) == 0) {
                    auVar251 = auVar251 ^ _DAT_01f46b70;
                  }
                  else {
                    pRVar130 = context->args;
                    if ((pRVar130->filter != (RTCFilterFunctionN)0x0) &&
                       (((pRVar130->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar26->field_8).field_0x2 & 0x40) != 0)))) {
                      (*pRVar130->filter)(&args);
                    }
                    auVar204._0_4_ = -(uint)(local_3c8._0_4_ == 0);
                    auVar204._4_4_ = -(uint)(local_3c8._4_4_ == 0);
                    auVar204._8_4_ = -(uint)(local_3c8._8_4_ == 0);
                    auVar204._12_4_ = -(uint)(local_3c8._12_4_ == 0);
                    auVar251 = auVar204 ^ _DAT_01f46b70;
                    *(undefined1 (*) [16])(args.ray + 0x80) =
                         ~auVar204 & _DAT_01f45a40 |
                         *(undefined1 (*) [16])(args.ray + 0x80) & auVar204;
                    pRVar128 = args.ray;
                  }
                  auVar252._0_4_ = auVar251._0_4_ << 0x1f;
                  auVar252._4_4_ = auVar251._4_4_ << 0x1f;
                  auVar252._8_4_ = auVar251._8_4_ << 0x1f;
                  auVar252._12_4_ = auVar251._12_4_ << 0x1f;
                  iVar207 = movmskps((int)pRVar128,auVar252);
                  if (iVar207 != 0) {
                    pRVar130 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar130 >> 8),1);
                    goto LAB_0038ad84;
                  }
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar133;
                  uVar131 = uVar131 ^ 1L << (uVar135 & 0x3f);
                  uVar135 = 0;
                  if (uVar131 != 0) {
                    for (; (uVar131 >> uVar135 & 1) == 0; uVar135 = uVar135 + 1) {
                    }
                  }
                }
                pRVar130 = (RTCIntersectArguments *)0x0;
              }
LAB_0038ad84:
              bVar136 = bVar136 | (byte)pRVar130;
            }
          }
        }
      }
    }
    if (bVar136 != 0) break;
    fVar211 = *(float *)(ray + k * 4 + 0x80);
    auVar249._4_4_ = -(uint)(fStack_44 <= fVar211);
    auVar249._0_4_ = -(uint)(local_48 <= fVar211);
    auVar249._8_4_ = -(uint)(fStack_40 <= fVar211);
    auVar249._12_4_ = -(uint)(fStack_3c <= fVar211);
    uVar138 = movmskps(uVar133,auVar249);
  }
  return uVar134 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }